

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

bool embree::avx512::CurveNiIntersectorK<8,16>::
     occluded_hn<embree::avx512::OrientedCurve1IntersectorK<embree::HermiteCurveT,16>,embree::avx512::Occluded1KEpilog1<16,true>>
               (Precalculations *pre,RayK<16> *ray,size_t k,RayQueryContext *context,Primitive *prim
               )

{
  float fVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  Primitive PVar6;
  uint uVar7;
  Geometry *pGVar8;
  long lVar9;
  __int_type_conflict _Var10;
  RTCFilterFunctionN p_Var11;
  undefined8 uVar12;
  bool bVar13;
  undefined8 uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  byte bVar24;
  uint uVar25;
  ulong uVar26;
  uint uVar28;
  uint uVar29;
  ulong uVar30;
  long lVar31;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  ulong uVar32;
  uint uVar33;
  bool bVar34;
  bool bVar35;
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar85 [64];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar86 [64];
  undefined1 auVar88 [64];
  undefined1 auVar90 [64];
  undefined1 auVar54 [16];
  undefined1 auVar92 [64];
  undefined1 auVar94 [64];
  undefined1 auVar96 [64];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar98 [64];
  undefined1 auVar99 [64];
  undefined1 auVar100 [64];
  undefined1 auVar101 [64];
  int iVar102;
  float fVar103;
  undefined4 uVar104;
  vfloat4 a0_2;
  undefined1 auVar105 [16];
  float fVar107;
  float fVar108;
  undefined1 auVar106 [64];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  vfloat4 b0;
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  float fVar125;
  vfloat4 a0_3;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  __m128 a_1;
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  float fVar168;
  float fVar169;
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  float fVar171;
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  float fVar170;
  undefined1 auVar167 [32];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [32];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  float fVar188;
  float fVar201;
  float fVar202;
  __m128 a;
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  float fVar203;
  float fVar204;
  float fVar212;
  float fVar213;
  float fVar214;
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  float fVar215;
  float fVar223;
  float fVar224;
  vfloat4 a0_1;
  undefined1 auVar216 [16];
  float fVar225;
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  vfloat4 a0;
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [32];
  undefined1 auVar236 [64];
  undefined1 auVar237 [64];
  undefined1 auVar238 [64];
  undefined1 auVar239 [64];
  undefined1 auVar240 [64];
  undefined1 auVar241 [64];
  undefined1 auVar242 [64];
  int iVar243;
  undefined1 in_ZMM30 [64];
  undefined1 auVar244 [64];
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  BBox1f cu_stack [4];
  vint<16> mask;
  BBox1f cv_stack [4];
  bool local_761;
  float local_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  uint auStack_5e0 [4];
  RTCFilterFunctionNArguments local_5d0;
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  undefined1 local_590 [16];
  undefined1 local_580 [16];
  undefined1 local_570 [16];
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  undefined1 local_550 [8];
  float fStack_548;
  float fStack_544;
  undefined1 local_540 [16];
  undefined1 local_530 [16];
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  undefined1 local_510 [16];
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  undefined1 local_4f0 [16];
  undefined1 local_4e0 [16];
  undefined1 local_4d0 [16];
  undefined1 local_4c0 [16];
  undefined1 local_4b0 [16];
  undefined1 local_4a0 [16];
  undefined1 local_490 [16];
  undefined1 local_480 [16];
  undefined1 local_470 [16];
  uint uStack_460;
  float afStack_45c [7];
  undefined1 local_440 [64];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  ulong auStack_3a0 [4];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined1 local_300 [64];
  RTCHitN local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  ulong uVar27;
  undefined1 auVar87 [64];
  undefined1 auVar89 [64];
  undefined1 auVar91 [64];
  undefined1 auVar93 [64];
  undefined1 auVar95 [64];
  undefined1 auVar97 [64];
  
  PVar6 = prim[1];
  uVar26 = (ulong)(byte)PVar6;
  fVar1 = *(float *)(prim + uVar26 * 0x19 + 0x12);
  auVar36 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x10);
  auVar36 = vinsertps_avx(auVar36,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar45 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar37 = vinsertps_avx(auVar45,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar39 = vsubps_avx(auVar36,*(undefined1 (*) [16])(prim + uVar26 * 0x19 + 6));
  fVar125 = fVar1 * auVar39._0_4_;
  fVar103 = fVar1 * auVar37._0_4_;
  auVar36._8_8_ = 0;
  auVar36._0_8_ = *(ulong *)(prim + uVar26 * 4 + 6);
  auVar70 = vpmovsxbd_avx2(auVar36);
  auVar70 = vcvtdq2ps_avx(auVar70);
  auVar45._8_8_ = 0;
  auVar45._0_8_ = *(ulong *)(prim + uVar26 * 5 + 6);
  auVar68 = vpmovsxbd_avx2(auVar45);
  auVar68 = vcvtdq2ps_avx(auVar68);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)(prim + uVar26 * 6 + 6);
  auVar69 = vpmovsxbd_avx2(auVar4);
  auVar69 = vcvtdq2ps_avx(auVar69);
  auVar46._8_8_ = 0;
  auVar46._0_8_ = *(ulong *)(prim + uVar26 * 0xb + 6);
  auVar81 = vpmovsxbd_avx2(auVar46);
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar47._8_8_ = 0;
  auVar47._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar6 * 0xc) + 6);
  auVar71 = vpmovsxbd_avx2(auVar47);
  auVar71 = vcvtdq2ps_avx(auVar71);
  auVar42._8_8_ = 0;
  auVar42._0_8_ = *(ulong *)(prim + (uint)(byte)PVar6 * 0xc + uVar26 + 6);
  auVar72 = vpmovsxbd_avx2(auVar42);
  auVar72 = vcvtdq2ps_avx(auVar72);
  uVar32 = (ulong)(uint)((int)(uVar26 * 9) * 2);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + uVar32 + 6);
  auVar73 = vpmovsxbd_avx2(auVar5);
  auVar48._8_8_ = 0;
  auVar48._0_8_ = *(ulong *)(prim + uVar32 + uVar26 + 6);
  auVar76 = vpmovsxbd_avx2(auVar48);
  auVar73 = vcvtdq2ps_avx(auVar73);
  auVar74 = vcvtdq2ps_avx(auVar76);
  uVar30 = (ulong)(uint)((int)(uVar26 * 5) << 2);
  auVar38._8_8_ = 0;
  auVar38._0_8_ = *(ulong *)(prim + uVar30 + 6);
  auVar66 = vpmovsxbd_avx2(auVar38);
  auVar75 = vcvtdq2ps_avx(auVar66);
  auVar133._4_4_ = fVar103;
  auVar133._0_4_ = fVar103;
  auVar133._8_4_ = fVar103;
  auVar133._12_4_ = fVar103;
  auVar133._16_4_ = fVar103;
  auVar133._20_4_ = fVar103;
  auVar133._24_4_ = fVar103;
  auVar133._28_4_ = fVar103;
  auVar235._8_4_ = 1;
  auVar235._0_8_ = 0x100000001;
  auVar235._12_4_ = 1;
  auVar235._16_4_ = 1;
  auVar235._20_4_ = 1;
  auVar235._24_4_ = 1;
  auVar235._28_4_ = 1;
  auVar77 = ZEXT1632(CONCAT412(fVar1 * auVar37._12_4_,
                               CONCAT48(fVar1 * auVar37._8_4_,
                                        CONCAT44(fVar1 * auVar37._4_4_,fVar103))));
  auVar67 = vpermps_avx2(auVar235,auVar77);
  auVar64 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar242 = ZEXT3264(auVar64);
  auVar65 = vpermps_avx512vl(auVar64,auVar77);
  fVar103 = auVar65._0_4_;
  fVar203 = auVar65._4_4_;
  auVar77._4_4_ = fVar203 * auVar69._4_4_;
  auVar77._0_4_ = fVar103 * auVar69._0_4_;
  fVar188 = auVar65._8_4_;
  auVar77._8_4_ = fVar188 * auVar69._8_4_;
  fVar201 = auVar65._12_4_;
  auVar77._12_4_ = fVar201 * auVar69._12_4_;
  fVar202 = auVar65._16_4_;
  auVar77._16_4_ = fVar202 * auVar69._16_4_;
  fVar107 = auVar65._20_4_;
  auVar77._20_4_ = fVar107 * auVar69._20_4_;
  fVar108 = auVar65._24_4_;
  auVar77._24_4_ = fVar108 * auVar69._24_4_;
  auVar77._28_4_ = auVar76._28_4_;
  auVar76._4_4_ = auVar72._4_4_ * fVar203;
  auVar76._0_4_ = auVar72._0_4_ * fVar103;
  auVar76._8_4_ = auVar72._8_4_ * fVar188;
  auVar76._12_4_ = auVar72._12_4_ * fVar201;
  auVar76._16_4_ = auVar72._16_4_ * fVar202;
  auVar76._20_4_ = auVar72._20_4_ * fVar107;
  auVar76._24_4_ = auVar72._24_4_ * fVar108;
  auVar76._28_4_ = auVar66._28_4_;
  auVar66._4_4_ = auVar75._4_4_ * fVar203;
  auVar66._0_4_ = auVar75._0_4_ * fVar103;
  auVar66._8_4_ = auVar75._8_4_ * fVar188;
  auVar66._12_4_ = auVar75._12_4_ * fVar201;
  auVar66._16_4_ = auVar75._16_4_ * fVar202;
  auVar66._20_4_ = auVar75._20_4_ * fVar107;
  auVar66._24_4_ = auVar75._24_4_ * fVar108;
  auVar66._28_4_ = auVar65._28_4_;
  auVar36 = vfmadd231ps_fma(auVar77,auVar67,auVar68);
  auVar45 = vfmadd231ps_fma(auVar76,auVar67,auVar71);
  auVar4 = vfmadd231ps_fma(auVar66,auVar74,auVar67);
  auVar36 = vfmadd231ps_fma(ZEXT1632(auVar36),auVar133,auVar70);
  auVar45 = vfmadd231ps_fma(ZEXT1632(auVar45),auVar133,auVar81);
  auVar4 = vfmadd231ps_fma(ZEXT1632(auVar4),auVar73,auVar133);
  auVar141._4_4_ = fVar125;
  auVar141._0_4_ = fVar125;
  auVar141._8_4_ = fVar125;
  auVar141._12_4_ = fVar125;
  auVar141._16_4_ = fVar125;
  auVar141._20_4_ = fVar125;
  auVar141._24_4_ = fVar125;
  auVar141._28_4_ = fVar125;
  auVar66 = ZEXT1632(CONCAT412(fVar1 * auVar39._12_4_,
                               CONCAT48(fVar1 * auVar39._8_4_,
                                        CONCAT44(fVar1 * auVar39._4_4_,fVar125))));
  auVar76 = vpermps_avx2(auVar235,auVar66);
  auVar66 = vpermps_avx512vl(auVar64,auVar66);
  auVar67 = vmulps_avx512vl(auVar66,auVar69);
  auVar79._0_4_ = auVar66._0_4_ * auVar72._0_4_;
  auVar79._4_4_ = auVar66._4_4_ * auVar72._4_4_;
  auVar79._8_4_ = auVar66._8_4_ * auVar72._8_4_;
  auVar79._12_4_ = auVar66._12_4_ * auVar72._12_4_;
  auVar79._16_4_ = auVar66._16_4_ * auVar72._16_4_;
  auVar79._20_4_ = auVar66._20_4_ * auVar72._20_4_;
  auVar79._24_4_ = auVar66._24_4_ * auVar72._24_4_;
  auVar79._28_4_ = 0;
  auVar72._4_4_ = auVar66._4_4_ * auVar75._4_4_;
  auVar72._0_4_ = auVar66._0_4_ * auVar75._0_4_;
  auVar72._8_4_ = auVar66._8_4_ * auVar75._8_4_;
  auVar72._12_4_ = auVar66._12_4_ * auVar75._12_4_;
  auVar72._16_4_ = auVar66._16_4_ * auVar75._16_4_;
  auVar72._20_4_ = auVar66._20_4_ * auVar75._20_4_;
  auVar72._24_4_ = auVar66._24_4_ * auVar75._24_4_;
  auVar72._28_4_ = auVar69._28_4_;
  auVar68 = vfmadd231ps_avx512vl(auVar67,auVar76,auVar68);
  auVar46 = vfmadd231ps_fma(auVar79,auVar76,auVar71);
  auVar47 = vfmadd231ps_fma(auVar72,auVar76,auVar74);
  auVar68 = vfmadd231ps_avx512vl(auVar68,auVar141,auVar70);
  auVar46 = vfmadd231ps_fma(ZEXT1632(auVar46),auVar141,auVar81);
  auVar47 = vfmadd231ps_fma(ZEXT1632(auVar47),auVar141,auVar73);
  auVar82._8_4_ = 0x7fffffff;
  auVar82._0_8_ = 0x7fffffff7fffffff;
  auVar82._12_4_ = 0x7fffffff;
  auVar82._16_4_ = 0x7fffffff;
  auVar82._20_4_ = 0x7fffffff;
  auVar82._24_4_ = 0x7fffffff;
  auVar82._28_4_ = 0x7fffffff;
  auVar70 = vandps_avx(ZEXT1632(auVar36),auVar82);
  auVar84._8_4_ = 0x219392ef;
  auVar84._0_8_ = 0x219392ef219392ef;
  auVar84._12_4_ = 0x219392ef;
  auVar84._16_4_ = 0x219392ef;
  auVar84._20_4_ = 0x219392ef;
  auVar84._24_4_ = 0x219392ef;
  auVar84._28_4_ = 0x219392ef;
  uVar32 = vcmpps_avx512vl(auVar70,auVar84,1);
  bVar34 = (bool)((byte)uVar32 & 1);
  auVar67._0_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * auVar36._0_4_;
  bVar34 = (bool)((byte)(uVar32 >> 1) & 1);
  auVar67._4_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * auVar36._4_4_;
  bVar34 = (bool)((byte)(uVar32 >> 2) & 1);
  auVar67._8_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * auVar36._8_4_;
  bVar34 = (bool)((byte)(uVar32 >> 3) & 1);
  auVar67._12_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * auVar36._12_4_;
  auVar67._16_4_ = (uint)((byte)(uVar32 >> 4) & 1) * 0x219392ef;
  auVar67._20_4_ = (uint)((byte)(uVar32 >> 5) & 1) * 0x219392ef;
  auVar67._24_4_ = (uint)((byte)(uVar32 >> 6) & 1) * 0x219392ef;
  auVar67._28_4_ = (uint)(byte)(uVar32 >> 7) * 0x219392ef;
  auVar70 = vandps_avx(ZEXT1632(auVar45),auVar82);
  uVar32 = vcmpps_avx512vl(auVar70,auVar84,1);
  bVar34 = (bool)((byte)uVar32 & 1);
  auVar64._0_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * auVar45._0_4_;
  bVar34 = (bool)((byte)(uVar32 >> 1) & 1);
  auVar64._4_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * auVar45._4_4_;
  bVar34 = (bool)((byte)(uVar32 >> 2) & 1);
  auVar64._8_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * auVar45._8_4_;
  bVar34 = (bool)((byte)(uVar32 >> 3) & 1);
  auVar64._12_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * auVar45._12_4_;
  auVar64._16_4_ = (uint)((byte)(uVar32 >> 4) & 1) * 0x219392ef;
  auVar64._20_4_ = (uint)((byte)(uVar32 >> 5) & 1) * 0x219392ef;
  auVar64._24_4_ = (uint)((byte)(uVar32 >> 6) & 1) * 0x219392ef;
  auVar64._28_4_ = (uint)(byte)(uVar32 >> 7) * 0x219392ef;
  auVar70 = vandps_avx(ZEXT1632(auVar4),auVar82);
  uVar32 = vcmpps_avx512vl(auVar70,auVar84,1);
  bVar34 = (bool)((byte)uVar32 & 1);
  auVar70._0_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * auVar4._0_4_;
  bVar34 = (bool)((byte)(uVar32 >> 1) & 1);
  auVar70._4_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * auVar4._4_4_;
  bVar34 = (bool)((byte)(uVar32 >> 2) & 1);
  auVar70._8_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * auVar4._8_4_;
  bVar34 = (bool)((byte)(uVar32 >> 3) & 1);
  auVar70._12_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * auVar4._12_4_;
  auVar70._16_4_ = (uint)((byte)(uVar32 >> 4) & 1) * 0x219392ef;
  auVar70._20_4_ = (uint)((byte)(uVar32 >> 5) & 1) * 0x219392ef;
  auVar70._24_4_ = (uint)((byte)(uVar32 >> 6) & 1) * 0x219392ef;
  auVar70._28_4_ = (uint)(byte)(uVar32 >> 7) * 0x219392ef;
  auVar69 = vrcp14ps_avx512vl(auVar67);
  auVar83._8_4_ = 0x3f800000;
  auVar83._0_8_ = &DAT_3f8000003f800000;
  auVar83._12_4_ = 0x3f800000;
  auVar83._16_4_ = 0x3f800000;
  auVar83._20_4_ = 0x3f800000;
  auVar83._24_4_ = 0x3f800000;
  auVar83._28_4_ = 0x3f800000;
  auVar36 = vfnmadd213ps_fma(auVar67,auVar69,auVar83);
  auVar36 = vfmadd132ps_fma(ZEXT1632(auVar36),auVar69,auVar69);
  auVar69 = vrcp14ps_avx512vl(auVar64);
  auVar45 = vfnmadd213ps_fma(auVar64,auVar69,auVar83);
  auVar45 = vfmadd132ps_fma(ZEXT1632(auVar45),auVar69,auVar69);
  auVar69 = vrcp14ps_avx512vl(auVar70);
  auVar4 = vfnmadd213ps_fma(auVar70,auVar69,auVar83);
  auVar4 = vfmadd132ps_fma(ZEXT1632(auVar4),auVar69,auVar69);
  auVar70 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar26 * 7 + 6));
  auVar70 = vcvtdq2ps_avx(auVar70);
  auVar69 = vsubps_avx512vl(auVar70,auVar68);
  auVar70 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar26 * 9 + 6));
  auVar73._4_4_ = auVar36._4_4_ * auVar69._4_4_;
  auVar73._0_4_ = auVar36._0_4_ * auVar69._0_4_;
  auVar73._8_4_ = auVar36._8_4_ * auVar69._8_4_;
  auVar73._12_4_ = auVar36._12_4_ * auVar69._12_4_;
  auVar73._16_4_ = auVar69._16_4_ * 0.0;
  auVar73._20_4_ = auVar69._20_4_ * 0.0;
  auVar73._24_4_ = auVar69._24_4_ * 0.0;
  auVar73._28_4_ = auVar69._28_4_;
  auVar70 = vcvtdq2ps_avx(auVar70);
  auVar70 = vsubps_avx512vl(auVar70,auVar68);
  auVar80._0_4_ = auVar36._0_4_ * auVar70._0_4_;
  auVar80._4_4_ = auVar36._4_4_ * auVar70._4_4_;
  auVar80._8_4_ = auVar36._8_4_ * auVar70._8_4_;
  auVar80._12_4_ = auVar36._12_4_ * auVar70._12_4_;
  auVar80._16_4_ = auVar70._16_4_ * 0.0;
  auVar80._20_4_ = auVar70._20_4_ * 0.0;
  auVar80._24_4_ = auVar70._24_4_ * 0.0;
  auVar80._28_4_ = 0;
  auVar68 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar6 * 0x10 + 6));
  auVar70 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                            (prim + (ulong)(byte)PVar6 * 0x10 + uVar26 * -2 + 6));
  auVar70 = vcvtdq2ps_avx(auVar70);
  auVar70 = vsubps_avx(auVar70,ZEXT1632(auVar46));
  auVar74._4_4_ = auVar45._4_4_ * auVar70._4_4_;
  auVar74._0_4_ = auVar45._0_4_ * auVar70._0_4_;
  auVar74._8_4_ = auVar45._8_4_ * auVar70._8_4_;
  auVar74._12_4_ = auVar45._12_4_ * auVar70._12_4_;
  auVar74._16_4_ = auVar70._16_4_ * 0.0;
  auVar74._20_4_ = auVar70._20_4_ * 0.0;
  auVar74._24_4_ = auVar70._24_4_ * 0.0;
  auVar74._28_4_ = auVar70._28_4_;
  auVar70 = vcvtdq2ps_avx(auVar68);
  auVar70 = vsubps_avx(auVar70,ZEXT1632(auVar46));
  auVar78._0_4_ = auVar45._0_4_ * auVar70._0_4_;
  auVar78._4_4_ = auVar45._4_4_ * auVar70._4_4_;
  auVar78._8_4_ = auVar45._8_4_ * auVar70._8_4_;
  auVar78._12_4_ = auVar45._12_4_ * auVar70._12_4_;
  auVar78._16_4_ = auVar70._16_4_ * 0.0;
  auVar78._20_4_ = auVar70._20_4_ * 0.0;
  auVar78._24_4_ = auVar70._24_4_ * 0.0;
  auVar78._28_4_ = 0;
  auVar70 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar30 + uVar26 + 6));
  auVar70 = vcvtdq2ps_avx(auVar70);
  auVar70 = vsubps_avx(auVar70,ZEXT1632(auVar47));
  auVar75._4_4_ = auVar70._4_4_ * auVar4._4_4_;
  auVar75._0_4_ = auVar70._0_4_ * auVar4._0_4_;
  auVar75._8_4_ = auVar70._8_4_ * auVar4._8_4_;
  auVar75._12_4_ = auVar70._12_4_ * auVar4._12_4_;
  auVar75._16_4_ = auVar70._16_4_ * 0.0;
  auVar75._20_4_ = auVar70._20_4_ * 0.0;
  auVar75._24_4_ = auVar70._24_4_ * 0.0;
  auVar75._28_4_ = auVar70._28_4_;
  auVar70 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar26 * 0x17 + 6));
  auVar70 = vcvtdq2ps_avx(auVar70);
  auVar70 = vsubps_avx(auVar70,ZEXT1632(auVar47));
  auVar65._0_4_ = auVar4._0_4_ * auVar70._0_4_;
  auVar65._4_4_ = auVar4._4_4_ * auVar70._4_4_;
  auVar65._8_4_ = auVar4._8_4_ * auVar70._8_4_;
  auVar65._12_4_ = auVar4._12_4_ * auVar70._12_4_;
  auVar65._16_4_ = auVar70._16_4_ * 0.0;
  auVar65._20_4_ = auVar70._20_4_ * 0.0;
  auVar65._24_4_ = auVar70._24_4_ * 0.0;
  auVar65._28_4_ = 0;
  auVar70 = vpminsd_avx2(auVar73,auVar80);
  auVar68 = vpminsd_avx2(auVar74,auVar78);
  auVar70 = vmaxps_avx(auVar70,auVar68);
  auVar68 = vpminsd_avx2(auVar75,auVar65);
  uVar104 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar69._4_4_ = uVar104;
  auVar69._0_4_ = uVar104;
  auVar69._8_4_ = uVar104;
  auVar69._12_4_ = uVar104;
  auVar69._16_4_ = uVar104;
  auVar69._20_4_ = uVar104;
  auVar69._24_4_ = uVar104;
  auVar69._28_4_ = uVar104;
  auVar68 = vmaxps_avx512vl(auVar68,auVar69);
  auVar70 = vmaxps_avx(auVar70,auVar68);
  auVar68._8_4_ = 0x3f7ffffa;
  auVar68._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar68._12_4_ = 0x3f7ffffa;
  auVar68._16_4_ = 0x3f7ffffa;
  auVar68._20_4_ = 0x3f7ffffa;
  auVar68._24_4_ = 0x3f7ffffa;
  auVar68._28_4_ = 0x3f7ffffa;
  local_400 = vmulps_avx512vl(auVar70,auVar68);
  auVar70 = vpmaxsd_avx2(auVar73,auVar80);
  auVar68 = vpmaxsd_avx2(auVar74,auVar78);
  auVar70 = vminps_avx(auVar70,auVar68);
  auVar68 = vpmaxsd_avx2(auVar75,auVar65);
  uVar104 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar81._4_4_ = uVar104;
  auVar81._0_4_ = uVar104;
  auVar81._8_4_ = uVar104;
  auVar81._12_4_ = uVar104;
  auVar81._16_4_ = uVar104;
  auVar81._20_4_ = uVar104;
  auVar81._24_4_ = uVar104;
  auVar81._28_4_ = uVar104;
  auVar68 = vminps_avx512vl(auVar68,auVar81);
  auVar70 = vminps_avx(auVar70,auVar68);
  auVar71._8_4_ = 0x3f800003;
  auVar71._0_8_ = 0x3f8000033f800003;
  auVar71._12_4_ = 0x3f800003;
  auVar71._16_4_ = 0x3f800003;
  auVar71._20_4_ = 0x3f800003;
  auVar71._24_4_ = 0x3f800003;
  auVar71._28_4_ = 0x3f800003;
  auVar70 = vmulps_avx512vl(auVar70,auVar71);
  auVar68 = vpbroadcastd_avx512vl();
  uVar14 = vpcmpgtd_avx512vl(auVar68,_DAT_0205a920);
  uVar12 = vcmpps_avx512vl(local_400,auVar70,2);
  bVar34 = (byte)((byte)uVar12 & (byte)uVar14) == 0;
  local_761 = !bVar34;
  if (bVar34) {
    return local_761;
  }
  uVar32 = (ulong)(byte)((byte)uVar12 & (byte)uVar14);
  auVar106 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_380 = vmovdqa64_avx512f(auVar106);
  auVar36 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar106 = ZEXT1664(auVar36);
  auVar36 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar238 = ZEXT1664(auVar36);
  auVar36 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar239 = ZEXT1664(auVar36);
  auVar36 = vxorps_avx512vl(in_ZMM30._0_16_,in_ZMM30._0_16_);
  auVar244 = ZEXT1664(auVar36);
LAB_01da2634:
  lVar31 = 0;
  for (uVar26 = uVar32; (uVar26 & 1) == 0; uVar26 = uVar26 >> 1 | 0x8000000000000000) {
    lVar31 = lVar31 + 1;
  }
  uVar33 = *(uint *)(prim + 2);
  pGVar8 = (context->scene->geometries).items[uVar33].ptr;
  lVar9 = *(long *)&pGVar8[1].time_range.upper;
  uVar26 = (ulong)*(uint *)(*(long *)&pGVar8->field_0x58 +
                           (ulong)*(uint *)(prim + lVar31 * 4 + 6) *
                           pGVar8[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  auVar36 = *(undefined1 (*) [16])(lVar9 + (long)pGVar8[1].intersectionFilterN * uVar26);
  lVar31 = uVar26 + 1;
  auVar45 = *(undefined1 (*) [16])(lVar9 + (long)pGVar8[1].intersectionFilterN * lVar31);
  _Var10 = pGVar8[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar4 = *(undefined1 (*) [16])(_Var10 + (long)pGVar8[2].userPtr * uVar26);
  auVar46 = *(undefined1 (*) [16])(_Var10 + (long)pGVar8[2].userPtr * lVar31);
  auVar85 = vpbroadcastd_avx512f();
  local_300 = vmovdqa64_avx512f(auVar85);
  auVar47 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x1c);
  auVar47 = vinsertps_avx(auVar47,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
  auVar37 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaab));
  auVar38 = vfmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        (pGVar8[2].intersectionFilterN + (long)pGVar8[2].pointQueryFunc * uVar26),
                       auVar36,auVar37);
  auVar39 = vfnmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        (pGVar8[2].intersectionFilterN + (long)pGVar8[2].pointQueryFunc * lVar31),
                       auVar45,auVar37);
  auVar40 = vfmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        ((long)pGVar8[3].userPtr + uVar26 * *(long *)&pGVar8[3].fnumTimeSegments),
                       auVar4,auVar37);
  auVar41 = vfnmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        ((long)pGVar8[3].userPtr + *(long *)&pGVar8[3].fnumTimeSegments * lVar31),
                       auVar46,auVar37);
  auVar109 = ZEXT816(0) << 0x40;
  auVar156._0_4_ = auVar45._0_4_ * 0.0;
  auVar156._4_4_ = auVar45._4_4_ * 0.0;
  auVar156._8_4_ = auVar45._8_4_ * 0.0;
  auVar156._12_4_ = auVar45._12_4_ * 0.0;
  auVar5 = vfmadd231ps_fma(auVar156,auVar39,auVar109);
  auVar42 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar38,auVar5);
  auVar172._0_4_ = auVar42._0_4_ + auVar36._0_4_;
  auVar172._4_4_ = auVar42._4_4_ + auVar36._4_4_;
  auVar172._8_4_ = auVar42._8_4_ + auVar36._8_4_;
  auVar172._12_4_ = auVar42._12_4_ + auVar36._12_4_;
  auVar49 = auVar106._0_16_;
  auVar42 = vfmadd231ps_avx512vl(auVar5,auVar38,auVar49);
  auVar43 = vfnmadd231ps_avx512vl(auVar42,auVar36,auVar49);
  auVar216._0_4_ = auVar46._0_4_ * 0.0;
  auVar216._4_4_ = auVar46._4_4_ * 0.0;
  auVar216._8_4_ = auVar46._8_4_ * 0.0;
  auVar216._12_4_ = auVar46._12_4_ * 0.0;
  auVar5 = vfmadd231ps_fma(auVar216,auVar41,auVar109);
  auVar42 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar40,auVar5);
  auVar226._0_4_ = auVar42._0_4_ + auVar4._0_4_;
  auVar226._4_4_ = auVar42._4_4_ + auVar4._4_4_;
  auVar226._8_4_ = auVar42._8_4_ + auVar4._8_4_;
  auVar226._12_4_ = auVar42._12_4_ + auVar4._12_4_;
  auVar42 = vfmadd231ps_avx512vl(auVar5,auVar40,auVar49);
  auVar44 = vfnmadd231ps_avx512vl(auVar42,auVar4,auVar49);
  auVar42 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar39,auVar45);
  auVar42 = vfmadd231ps_fma(auVar42,auVar38,auVar109);
  auVar48 = vfmadd231ps_fma(auVar42,auVar36,auVar109);
  auVar45 = vmulps_avx512vl(auVar45,auVar49);
  auVar45 = vfnmadd231ps_avx512vl(auVar45,auVar49,auVar39);
  auVar45 = vfmadd231ps_fma(auVar45,auVar109,auVar38);
  auVar38 = vfnmadd231ps_fma(auVar45,auVar109,auVar36);
  auVar36 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar41,auVar46);
  auVar36 = vfmadd231ps_fma(auVar36,auVar40,auVar109);
  auVar42 = vfmadd231ps_fma(auVar36,auVar4,auVar109);
  auVar36 = vmulps_avx512vl(auVar46,auVar49);
  auVar36 = vfnmadd231ps_avx512vl(auVar36,auVar49,auVar41);
  auVar36 = vfmadd231ps_fma(auVar36,auVar109,auVar40);
  auVar5 = vfnmadd231ps_fma(auVar36,auVar109,auVar4);
  auVar36 = vshufps_avx(auVar43,auVar43,0xc9);
  auVar45 = vshufps_avx(auVar226,auVar226,0xc9);
  fVar125 = auVar43._0_4_;
  auVar56._0_4_ = fVar125 * auVar45._0_4_;
  fVar168 = auVar43._4_4_;
  auVar56._4_4_ = fVar168 * auVar45._4_4_;
  fVar169 = auVar43._8_4_;
  auVar56._8_4_ = fVar169 * auVar45._8_4_;
  fVar170 = auVar43._12_4_;
  auVar56._12_4_ = fVar170 * auVar45._12_4_;
  auVar45 = vfmsub231ps_fma(auVar56,auVar36,auVar226);
  auVar4 = vshufps_avx(auVar45,auVar45,0xc9);
  auVar45 = vshufps_avx(auVar44,auVar44,0xc9);
  auVar59._0_4_ = fVar125 * auVar45._0_4_;
  auVar59._4_4_ = fVar168 * auVar45._4_4_;
  auVar59._8_4_ = fVar169 * auVar45._8_4_;
  auVar59._12_4_ = fVar170 * auVar45._12_4_;
  auVar36 = vfmsub231ps_fma(auVar59,auVar36,auVar44);
  auVar46 = vshufps_avx(auVar36,auVar36,0xc9);
  auVar36 = vshufps_avx(auVar38,auVar38,0xc9);
  auVar45 = vshufps_avx(auVar42,auVar42,0xc9);
  fVar1 = auVar38._0_4_;
  auVar189._0_4_ = auVar45._0_4_ * fVar1;
  fVar103 = auVar38._4_4_;
  auVar189._4_4_ = auVar45._4_4_ * fVar103;
  fVar203 = auVar38._8_4_;
  auVar189._8_4_ = auVar45._8_4_ * fVar203;
  fVar188 = auVar38._12_4_;
  auVar189._12_4_ = auVar45._12_4_ * fVar188;
  auVar45 = vfmsub231ps_fma(auVar189,auVar36,auVar42);
  auVar42 = vshufps_avx(auVar45,auVar45,0xc9);
  auVar45 = vshufps_avx(auVar5,auVar5,0xc9);
  auVar190._0_4_ = auVar45._0_4_ * fVar1;
  auVar190._4_4_ = auVar45._4_4_ * fVar103;
  auVar190._8_4_ = auVar45._8_4_ * fVar203;
  auVar190._12_4_ = auVar45._12_4_ * fVar188;
  auVar36 = vfmsub231ps_fma(auVar190,auVar36,auVar5);
  auVar5 = vshufps_avx(auVar36,auVar36,0xc9);
  auVar36 = vdpps_avx(auVar4,auVar4,0x7f);
  fVar201 = auVar36._0_4_;
  auVar191._4_12_ = ZEXT812(0) << 0x20;
  auVar191._0_4_ = fVar201;
  auVar45 = vrsqrt14ss_avx512f(auVar109,auVar191);
  auVar39 = vmulss_avx512f(auVar45,ZEXT416(0x3fc00000));
  auVar40 = vmulss_avx512f(auVar36,ZEXT416(0x3f000000));
  fVar202 = auVar45._0_4_;
  fVar107 = auVar39._0_4_ - auVar40._0_4_ * fVar202 * fVar202 * fVar202;
  fVar215 = fVar107 * auVar4._0_4_;
  fVar223 = fVar107 * auVar4._4_4_;
  fVar224 = fVar107 * auVar4._8_4_;
  fVar225 = fVar107 * auVar4._12_4_;
  auVar45 = vdpps_avx(auVar4,auVar46,0x7f);
  auVar63._0_4_ = fVar201 * auVar46._0_4_;
  auVar63._4_4_ = fVar201 * auVar46._4_4_;
  auVar63._8_4_ = fVar201 * auVar46._8_4_;
  auVar63._12_4_ = fVar201 * auVar46._12_4_;
  fVar201 = auVar45._0_4_;
  auVar57._0_4_ = fVar201 * auVar4._0_4_;
  auVar57._4_4_ = fVar201 * auVar4._4_4_;
  auVar57._8_4_ = fVar201 * auVar4._8_4_;
  auVar57._12_4_ = fVar201 * auVar4._12_4_;
  auVar4 = vsubps_avx(auVar63,auVar57);
  auVar45 = vrcp14ss_avx512f(auVar109,auVar191);
  auVar36 = vfnmadd213ss_avx512f(auVar36,auVar45,ZEXT416(0x40000000));
  fVar201 = auVar45._0_4_ * auVar36._0_4_;
  auVar36 = vdpps_avx(auVar42,auVar42,0x7f);
  fVar202 = auVar36._0_4_;
  auVar136._4_12_ = ZEXT812(0) << 0x20;
  auVar136._0_4_ = fVar202;
  auVar45 = vrsqrt14ss_avx512f(auVar109,auVar136);
  auVar46 = vmulss_avx512f(auVar45,ZEXT416(0x3fc00000));
  auVar39 = vmulss_avx512f(auVar36,ZEXT416(0x3f000000));
  fVar108 = auVar45._0_4_;
  fVar108 = auVar46._0_4_ - auVar39._0_4_ * fVar108 * fVar108 * fVar108;
  fVar204 = fVar108 * auVar42._0_4_;
  fVar212 = fVar108 * auVar42._4_4_;
  fVar213 = fVar108 * auVar42._8_4_;
  fVar214 = fVar108 * auVar42._12_4_;
  auVar45 = vdpps_avx(auVar42,auVar5,0x7f);
  auVar49._0_4_ = fVar202 * auVar5._0_4_;
  auVar49._4_4_ = fVar202 * auVar5._4_4_;
  auVar49._8_4_ = fVar202 * auVar5._8_4_;
  auVar49._12_4_ = fVar202 * auVar5._12_4_;
  fVar202 = auVar45._0_4_;
  auVar39._0_4_ = fVar202 * auVar42._0_4_;
  auVar39._4_4_ = fVar202 * auVar42._4_4_;
  auVar39._8_4_ = fVar202 * auVar42._8_4_;
  auVar39._12_4_ = fVar202 * auVar42._12_4_;
  auVar46 = vsubps_avx(auVar49,auVar39);
  auVar45 = vrcp14ss_avx512f(auVar109,auVar136);
  auVar36 = vfnmadd213ss_avx512f(auVar36,auVar45,ZEXT416(0x40000000));
  fVar202 = auVar45._0_4_ * auVar36._0_4_;
  auVar36 = vshufps_avx(auVar172,auVar172,0xff);
  auVar58._0_4_ = fVar215 * auVar36._0_4_;
  auVar58._4_4_ = fVar223 * auVar36._4_4_;
  auVar58._8_4_ = fVar224 * auVar36._8_4_;
  auVar58._12_4_ = fVar225 * auVar36._12_4_;
  local_4f0 = vsubps_avx(auVar172,auVar58);
  auVar45 = vshufps_avx(auVar43,auVar43,0xff);
  auVar50._0_4_ = fVar215 * auVar45._0_4_ + auVar36._0_4_ * fVar107 * auVar4._0_4_ * fVar201;
  auVar50._4_4_ = fVar223 * auVar45._4_4_ + auVar36._4_4_ * fVar107 * auVar4._4_4_ * fVar201;
  auVar50._8_4_ = fVar224 * auVar45._8_4_ + auVar36._8_4_ * fVar107 * auVar4._8_4_ * fVar201;
  auVar50._12_4_ = fVar225 * auVar45._12_4_ + auVar36._12_4_ * fVar107 * auVar4._12_4_ * fVar201;
  auVar4 = vsubps_avx(auVar43,auVar50);
  local_500._0_4_ = auVar172._0_4_ + auVar58._0_4_;
  local_500._4_4_ = auVar172._4_4_ + auVar58._4_4_;
  fStack_4f8 = auVar172._8_4_ + auVar58._8_4_;
  fStack_4f4 = auVar172._12_4_ + auVar58._12_4_;
  auVar51._0_4_ = fVar125 + auVar50._0_4_;
  auVar51._4_4_ = fVar168 + auVar50._4_4_;
  auVar51._8_4_ = fVar169 + auVar50._8_4_;
  auVar51._12_4_ = fVar170 + auVar50._12_4_;
  auVar36 = vshufps_avx(auVar48,auVar48,0xff);
  auVar143._0_4_ = fVar204 * auVar36._0_4_;
  auVar143._4_4_ = fVar212 * auVar36._4_4_;
  auVar143._8_4_ = fVar213 * auVar36._8_4_;
  auVar143._12_4_ = fVar214 * auVar36._12_4_;
  local_510 = vsubps_avx(auVar48,auVar143);
  auVar45 = vshufps_avx(auVar38,auVar38,0xff);
  auVar40._0_4_ = fVar204 * auVar45._0_4_ + auVar36._0_4_ * fVar108 * auVar46._0_4_ * fVar202;
  auVar40._4_4_ = fVar212 * auVar45._4_4_ + auVar36._4_4_ * fVar108 * auVar46._4_4_ * fVar202;
  auVar40._8_4_ = fVar213 * auVar45._8_4_ + auVar36._8_4_ * fVar108 * auVar46._8_4_ * fVar202;
  auVar40._12_4_ = fVar214 * auVar45._12_4_ + auVar36._12_4_ * fVar108 * auVar46._12_4_ * fVar202;
  auVar36 = vsubps_avx(auVar38,auVar40);
  _local_520 = vaddps_avx512vl(auVar48,auVar143);
  auVar41._0_4_ = fVar1 + auVar40._0_4_;
  auVar41._4_4_ = fVar103 + auVar40._4_4_;
  auVar41._8_4_ = fVar203 + auVar40._8_4_;
  auVar41._12_4_ = fVar188 + auVar40._12_4_;
  auVar45 = vmulps_avx512vl(auVar4,auVar37);
  local_530 = vaddps_avx512vl(local_4f0,auVar45);
  auVar36 = vmulps_avx512vl(auVar36,auVar37);
  local_540 = vsubps_avx512vl(local_510,auVar36);
  auVar36 = vmulps_avx512vl(auVar51,auVar37);
  _local_550 = vaddps_avx512vl(_local_500,auVar36);
  auVar36 = vmulps_avx512vl(auVar41,auVar37);
  _local_560 = vsubps_avx512vl(_local_520,auVar36);
  local_470 = vsubps_avx(local_4f0,auVar47);
  uVar104 = local_470._0_4_;
  auVar43._4_4_ = uVar104;
  auVar43._0_4_ = uVar104;
  auVar43._8_4_ = uVar104;
  auVar43._12_4_ = uVar104;
  auVar36 = vshufps_avx(local_470,local_470,0x55);
  auVar45 = vshufps_avx(local_470,local_470,0xaa);
  aVar2 = pre->ray_space[k].vx.field_0;
  aVar3 = pre->ray_space[k].vy.field_0;
  fVar1 = pre->ray_space[k].vz.field_0.m128[0];
  fVar103 = pre->ray_space[k].vz.field_0.m128[1];
  fVar203 = pre->ray_space[k].vz.field_0.m128[2];
  fVar188 = pre->ray_space[k].vz.field_0.m128[3];
  auVar37._0_4_ = fVar1 * auVar45._0_4_;
  auVar37._4_4_ = fVar103 * auVar45._4_4_;
  auVar37._8_4_ = fVar203 * auVar45._8_4_;
  auVar37._12_4_ = fVar188 * auVar45._12_4_;
  auVar36 = vfmadd231ps_fma(auVar37,(undefined1  [16])aVar3,auVar36);
  auVar48 = vfmadd231ps_fma(auVar36,(undefined1  [16])aVar2,auVar43);
  local_480 = vsubps_avx512vl(local_530,auVar47);
  uVar104 = local_480._0_4_;
  auVar52._4_4_ = uVar104;
  auVar52._0_4_ = uVar104;
  auVar52._8_4_ = uVar104;
  auVar52._12_4_ = uVar104;
  auVar36 = vshufps_avx(local_480,local_480,0x55);
  auVar45 = vshufps_avx(local_480,local_480,0xaa);
  auVar44._0_4_ = fVar1 * auVar45._0_4_;
  auVar44._4_4_ = fVar103 * auVar45._4_4_;
  auVar44._8_4_ = fVar203 * auVar45._8_4_;
  auVar44._12_4_ = fVar188 * auVar45._12_4_;
  auVar36 = vfmadd231ps_fma(auVar44,(undefined1  [16])aVar3,auVar36);
  auVar38 = vfmadd231ps_fma(auVar36,(undefined1  [16])aVar2,auVar52);
  local_490 = vsubps_avx512vl(local_540,auVar47);
  uVar104 = local_490._0_4_;
  auVar54._4_4_ = uVar104;
  auVar54._0_4_ = uVar104;
  auVar54._8_4_ = uVar104;
  auVar54._12_4_ = uVar104;
  auVar36 = vshufps_avx(local_490,local_490,0x55);
  auVar45 = vshufps_avx(local_490,local_490,0xaa);
  auVar173._0_4_ = auVar45._0_4_ * fVar1;
  auVar173._4_4_ = auVar45._4_4_ * fVar103;
  auVar173._8_4_ = auVar45._8_4_ * fVar203;
  auVar173._12_4_ = auVar45._12_4_ * fVar188;
  auVar36 = vfmadd231ps_fma(auVar173,(undefined1  [16])aVar3,auVar36);
  auVar37 = vfmadd231ps_fma(auVar36,(undefined1  [16])aVar2,auVar54);
  local_4a0 = vsubps_avx(local_510,auVar47);
  uVar104 = local_4a0._0_4_;
  auVar53._4_4_ = uVar104;
  auVar53._0_4_ = uVar104;
  auVar53._8_4_ = uVar104;
  auVar53._12_4_ = uVar104;
  auVar36 = vshufps_avx(local_4a0,local_4a0,0x55);
  auVar45 = vshufps_avx(local_4a0,local_4a0,0xaa);
  auVar181._0_4_ = auVar45._0_4_ * fVar1;
  auVar181._4_4_ = auVar45._4_4_ * fVar103;
  auVar181._8_4_ = auVar45._8_4_ * fVar203;
  auVar181._12_4_ = auVar45._12_4_ * fVar188;
  auVar36 = vfmadd231ps_fma(auVar181,(undefined1  [16])aVar3,auVar36);
  auVar39 = vfmadd231ps_fma(auVar36,(undefined1  [16])aVar2,auVar53);
  local_4b0 = vsubps_avx(_local_500,auVar47);
  uVar104 = local_4b0._0_4_;
  auVar61._4_4_ = uVar104;
  auVar61._0_4_ = uVar104;
  auVar61._8_4_ = uVar104;
  auVar61._12_4_ = uVar104;
  auVar36 = vshufps_avx(local_4b0,local_4b0,0x55);
  auVar45 = vshufps_avx(local_4b0,local_4b0,0xaa);
  auVar192._0_4_ = auVar45._0_4_ * fVar1;
  auVar192._4_4_ = auVar45._4_4_ * fVar103;
  auVar192._8_4_ = auVar45._8_4_ * fVar203;
  auVar192._12_4_ = auVar45._12_4_ * fVar188;
  auVar36 = vfmadd231ps_fma(auVar192,(undefined1  [16])aVar3,auVar36);
  auVar40 = vfmadd231ps_fma(auVar36,(undefined1  [16])aVar2,auVar61);
  local_4c0 = vsubps_avx512vl(_local_550,auVar47);
  uVar104 = local_4c0._0_4_;
  auVar62._4_4_ = uVar104;
  auVar62._0_4_ = uVar104;
  auVar62._8_4_ = uVar104;
  auVar62._12_4_ = uVar104;
  auVar36 = vshufps_avx(local_4c0,local_4c0,0x55);
  auVar45 = vshufps_avx(local_4c0,local_4c0,0xaa);
  auVar205._0_4_ = auVar45._0_4_ * fVar1;
  auVar205._4_4_ = auVar45._4_4_ * fVar103;
  auVar205._8_4_ = auVar45._8_4_ * fVar203;
  auVar205._12_4_ = auVar45._12_4_ * fVar188;
  auVar36 = vfmadd231ps_fma(auVar205,(undefined1  [16])aVar3,auVar36);
  auVar41 = vfmadd231ps_fma(auVar36,(undefined1  [16])aVar2,auVar62);
  local_4d0 = vsubps_avx512vl(_local_560,auVar47);
  uVar104 = local_4d0._0_4_;
  auVar60._4_4_ = uVar104;
  auVar60._0_4_ = uVar104;
  auVar60._8_4_ = uVar104;
  auVar60._12_4_ = uVar104;
  auVar36 = vshufps_avx(local_4d0,local_4d0,0x55);
  auVar45 = vshufps_avx(local_4d0,local_4d0,0xaa);
  auVar217._0_4_ = auVar45._0_4_ * fVar1;
  auVar217._4_4_ = auVar45._4_4_ * fVar103;
  auVar217._8_4_ = auVar45._8_4_ * fVar203;
  auVar217._12_4_ = auVar45._12_4_ * fVar188;
  auVar36 = vfmadd231ps_fma(auVar217,(undefined1  [16])aVar3,auVar36);
  auVar43 = vfmadd231ps_fma(auVar36,(undefined1  [16])aVar2,auVar60);
  local_4e0 = vsubps_avx512vl(_local_520,auVar47);
  uVar104 = local_4e0._0_4_;
  auVar55._4_4_ = uVar104;
  auVar55._0_4_ = uVar104;
  auVar55._8_4_ = uVar104;
  auVar55._12_4_ = uVar104;
  auVar36 = vshufps_avx(local_4e0,local_4e0,0x55);
  auVar45 = vshufps_avx(local_4e0,local_4e0,0xaa);
  auVar144._0_4_ = fVar1 * auVar45._0_4_;
  auVar144._4_4_ = fVar103 * auVar45._4_4_;
  auVar144._8_4_ = fVar203 * auVar45._8_4_;
  auVar144._12_4_ = fVar188 * auVar45._12_4_;
  auVar36 = vfmadd231ps_fma(auVar144,(undefined1  [16])aVar3,auVar36);
  auVar44 = vfmadd231ps_fma(auVar36,(undefined1  [16])aVar2,auVar55);
  auVar4 = vmovlhps_avx(auVar48,auVar40);
  auVar46 = vmovlhps_avx(auVar38,auVar41);
  auVar42 = vmovlhps_avx512f(auVar37,auVar43);
  auVar5 = vmovlhps_avx512f(auVar39,auVar44);
  auVar45 = vminps_avx(auVar4,auVar46);
  auVar36 = vmaxps_avx(auVar4,auVar46);
  auVar47 = vminps_avx512vl(auVar42,auVar5);
  auVar45 = vminps_avx(auVar45,auVar47);
  auVar47 = vmaxps_avx512vl(auVar42,auVar5);
  auVar36 = vmaxps_avx(auVar36,auVar47);
  auVar47 = vshufpd_avx(auVar45,auVar45,3);
  auVar45 = vminps_avx(auVar45,auVar47);
  auVar47 = vshufpd_avx(auVar36,auVar36,3);
  auVar36 = vmaxps_avx(auVar36,auVar47);
  auVar45 = vandps_avx512vl(auVar45,auVar238._0_16_);
  auVar36 = vandps_avx512vl(auVar36,auVar238._0_16_);
  auVar36 = vmaxps_avx(auVar45,auVar36);
  auVar45 = vmovshdup_avx(auVar36);
  auVar36 = vmaxss_avx(auVar45,auVar36);
  fVar103 = auVar36._0_4_ * 9.536743e-07;
  auVar47 = vmovddup_avx512vl(auVar48);
  auVar48 = vmovddup_avx512vl(auVar38);
  auVar109._8_8_ = auVar37._0_8_;
  auVar109._0_8_ = auVar37._0_8_;
  auVar126._8_8_ = auVar39._0_8_;
  auVar126._0_8_ = auVar39._0_8_;
  local_3c0 = vbroadcastss_avx512vl(ZEXT416((uint)fVar103));
  auVar36 = vxorps_avx512vl(local_3c0._0_16_,auVar239._0_16_);
  local_3e0 = vbroadcastss_avx512vl(auVar36);
  bVar34 = false;
  uVar26 = 0;
  fVar1 = *(float *)(ray + k * 4 + 0xc0);
  auVar36 = vsubps_avx(auVar46,auVar4);
  auVar38 = vsubps_avx512vl(auVar42,auVar46);
  auVar85._0_16_ = vsubps_avx512vl(auVar5,auVar42);
  local_570 = vsubps_avx(_local_500,local_4f0);
  local_580 = vsubps_avx512vl(_local_550,local_530);
  local_590 = vsubps_avx512vl(_local_560,local_540);
  _local_5a0 = vsubps_avx512vl(_local_520,local_510);
  auVar106 = vpbroadcastd_avx512f();
  local_340 = vmovdqa64_avx512f(auVar106);
  auVar45 = ZEXT816(0x3f80000000000000);
  auVar236 = ZEXT1664(auVar45);
  auVar99._32_32_ = auVar106._32_32_;
  do {
    auVar53 = auVar236._0_16_;
    auVar37 = vshufps_avx(auVar53,auVar53,0x50);
    auVar71 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar39 = vsubps_avx512vl(auVar71._0_16_,auVar37);
    fVar203 = auVar37._0_4_;
    fVar214 = auVar40._0_4_;
    auVar127._0_4_ = fVar214 * fVar203;
    fVar188 = auVar37._4_4_;
    fVar215 = auVar40._4_4_;
    auVar127._4_4_ = fVar215 * fVar188;
    fVar201 = auVar37._8_4_;
    auVar127._8_4_ = fVar214 * fVar201;
    fVar202 = auVar37._12_4_;
    auVar127._12_4_ = fVar215 * fVar202;
    fVar107 = auVar41._0_4_;
    auVar137._0_4_ = fVar107 * fVar203;
    fVar108 = auVar41._4_4_;
    auVar137._4_4_ = fVar108 * fVar188;
    auVar137._8_4_ = fVar107 * fVar201;
    auVar137._12_4_ = fVar108 * fVar202;
    fVar125 = auVar43._0_4_;
    auVar145._0_4_ = fVar125 * fVar203;
    fVar168 = auVar43._4_4_;
    auVar145._4_4_ = fVar168 * fVar188;
    auVar145._8_4_ = fVar125 * fVar201;
    auVar145._12_4_ = fVar168 * fVar202;
    fVar169 = auVar44._0_4_;
    auVar110._0_4_ = fVar169 * fVar203;
    fVar170 = auVar44._4_4_;
    auVar110._4_4_ = fVar170 * fVar188;
    auVar110._8_4_ = fVar169 * fVar201;
    auVar110._12_4_ = fVar170 * fVar202;
    auVar49 = vfmadd231ps_avx512vl(auVar127,auVar39,auVar47);
    auVar50 = vfmadd231ps_avx512vl(auVar137,auVar39,auVar48);
    auVar51 = vfmadd231ps_avx512vl(auVar145,auVar39,auVar109);
    auVar39 = vfmadd231ps_fma(auVar110,auVar126,auVar39);
    auVar37 = vmovshdup_avx(auVar45);
    fVar188 = auVar45._0_4_;
    fVar203 = (auVar37._0_4_ - fVar188) * 0.04761905;
    auVar167._4_4_ = fVar188;
    auVar167._0_4_ = fVar188;
    auVar167._8_4_ = fVar188;
    auVar167._12_4_ = fVar188;
    auVar167._16_4_ = fVar188;
    auVar167._20_4_ = fVar188;
    auVar167._24_4_ = fVar188;
    auVar167._28_4_ = fVar188;
    auVar122._0_8_ = auVar37._0_8_;
    auVar122._8_8_ = auVar122._0_8_;
    auVar122._16_8_ = auVar122._0_8_;
    auVar122._24_8_ = auVar122._0_8_;
    auVar70 = vsubps_avx(auVar122,auVar167);
    uVar104 = auVar49._0_4_;
    auVar123._4_4_ = uVar104;
    auVar123._0_4_ = uVar104;
    auVar123._8_4_ = uVar104;
    auVar123._12_4_ = uVar104;
    auVar123._16_4_ = uVar104;
    auVar123._20_4_ = uVar104;
    auVar123._24_4_ = uVar104;
    auVar123._28_4_ = uVar104;
    auVar185._8_4_ = 1;
    auVar185._0_8_ = 0x100000001;
    auVar185._12_4_ = 1;
    auVar185._16_4_ = 1;
    auVar185._20_4_ = 1;
    auVar185._24_4_ = 1;
    auVar185._28_4_ = 1;
    auVar69 = ZEXT1632(auVar49);
    auVar68 = vpermps_avx2(auVar185,auVar69);
    auVar72 = vbroadcastss_avx512vl(auVar50);
    auVar81 = ZEXT1632(auVar50);
    auVar73 = vpermps_avx512vl(auVar185,auVar81);
    auVar74 = vbroadcastss_avx512vl(auVar51);
    auVar78 = ZEXT1632(auVar51);
    auVar75 = vpermps_avx512vl(auVar185,auVar78);
    auVar76 = vbroadcastss_avx512vl(auVar39);
    auVar79 = ZEXT1632(auVar39);
    auVar66 = vpermps_avx512vl(auVar185,auVar79);
    auVar186._4_4_ = fVar203;
    auVar186._0_4_ = fVar203;
    auVar186._8_4_ = fVar203;
    auVar186._12_4_ = fVar203;
    auVar186._16_4_ = fVar203;
    auVar186._20_4_ = fVar203;
    auVar186._24_4_ = fVar203;
    auVar186._28_4_ = fVar203;
    auVar80 = auVar242._0_32_;
    auVar67 = vpermps_avx512vl(auVar80,auVar69);
    auVar154._8_4_ = 3;
    auVar154._0_8_ = 0x300000003;
    auVar154._12_4_ = 3;
    auVar154._16_4_ = 3;
    auVar154._20_4_ = 3;
    auVar154._24_4_ = 3;
    auVar154._28_4_ = 3;
    auVar77 = vpermps_avx512vl(auVar154,auVar69);
    auVar64 = vpermps_avx512vl(auVar80,auVar81);
    auVar69 = vpermps_avx2(auVar154,auVar81);
    auVar65 = vpermps_avx512vl(auVar80,auVar78);
    auVar81 = vpermps_avx2(auVar154,auVar78);
    auVar78 = vpermps_avx512vl(auVar80,auVar79);
    auVar79 = vpermps_avx512vl(auVar154,auVar79);
    auVar37 = vfmadd132ps_fma(auVar70,auVar167,_DAT_02020f20);
    auVar71 = vsubps_avx512vl(auVar71,ZEXT1632(auVar37));
    auVar70 = vmulps_avx512vl(auVar72,ZEXT1632(auVar37));
    auVar82 = ZEXT1632(auVar37);
    auVar80 = vmulps_avx512vl(auVar73,auVar82);
    auVar39 = vfmadd231ps_fma(auVar70,auVar71,auVar123);
    auVar49 = vfmadd231ps_fma(auVar80,auVar71,auVar68);
    auVar70 = vmulps_avx512vl(auVar74,auVar82);
    auVar80 = vmulps_avx512vl(auVar75,auVar82);
    auVar70 = vfmadd231ps_avx512vl(auVar70,auVar71,auVar72);
    auVar72 = vfmadd231ps_avx512vl(auVar80,auVar71,auVar73);
    auVar73 = vmulps_avx512vl(auVar76,auVar82);
    auVar80 = ZEXT1632(auVar37);
    auVar66 = vmulps_avx512vl(auVar66,auVar80);
    auVar73 = vfmadd231ps_avx512vl(auVar73,auVar71,auVar74);
    auVar74 = vfmadd231ps_avx512vl(auVar66,auVar71,auVar75);
    fVar201 = auVar37._0_4_;
    fVar202 = auVar37._4_4_;
    auVar17._4_4_ = fVar202 * auVar70._4_4_;
    auVar17._0_4_ = fVar201 * auVar70._0_4_;
    fVar204 = auVar37._8_4_;
    auVar17._8_4_ = fVar204 * auVar70._8_4_;
    fVar212 = auVar37._12_4_;
    auVar17._12_4_ = fVar212 * auVar70._12_4_;
    auVar17._16_4_ = auVar70._16_4_ * 0.0;
    auVar17._20_4_ = auVar70._20_4_ * 0.0;
    auVar17._24_4_ = auVar70._24_4_ * 0.0;
    auVar17._28_4_ = fVar188;
    auVar18._4_4_ = fVar202 * auVar72._4_4_;
    auVar18._0_4_ = fVar201 * auVar72._0_4_;
    auVar18._8_4_ = fVar204 * auVar72._8_4_;
    auVar18._12_4_ = fVar212 * auVar72._12_4_;
    auVar18._16_4_ = auVar72._16_4_ * 0.0;
    auVar18._20_4_ = auVar72._20_4_ * 0.0;
    auVar18._24_4_ = auVar72._24_4_ * 0.0;
    auVar18._28_4_ = auVar68._28_4_;
    auVar39 = vfmadd231ps_fma(auVar17,auVar71,ZEXT1632(auVar39));
    auVar49 = vfmadd231ps_fma(auVar18,auVar71,ZEXT1632(auVar49));
    auVar116._0_4_ = fVar201 * auVar73._0_4_;
    auVar116._4_4_ = fVar202 * auVar73._4_4_;
    auVar116._8_4_ = fVar204 * auVar73._8_4_;
    auVar116._12_4_ = fVar212 * auVar73._12_4_;
    auVar116._16_4_ = auVar73._16_4_ * 0.0;
    auVar116._20_4_ = auVar73._20_4_ * 0.0;
    auVar116._24_4_ = auVar73._24_4_ * 0.0;
    auVar116._28_4_ = 0;
    auVar19._4_4_ = fVar202 * auVar74._4_4_;
    auVar19._0_4_ = fVar201 * auVar74._0_4_;
    auVar19._8_4_ = fVar204 * auVar74._8_4_;
    auVar19._12_4_ = fVar212 * auVar74._12_4_;
    auVar19._16_4_ = auVar74._16_4_ * 0.0;
    auVar19._20_4_ = auVar74._20_4_ * 0.0;
    auVar19._24_4_ = auVar74._24_4_ * 0.0;
    auVar19._28_4_ = auVar73._28_4_;
    auVar50 = vfmadd231ps_fma(auVar116,auVar71,auVar70);
    auVar51 = vfmadd231ps_fma(auVar19,auVar71,auVar72);
    auVar20._28_4_ = auVar72._28_4_;
    auVar20._0_28_ =
         ZEXT1628(CONCAT412(fVar212 * auVar51._12_4_,
                            CONCAT48(fVar204 * auVar51._8_4_,
                                     CONCAT44(fVar202 * auVar51._4_4_,fVar201 * auVar51._0_4_))));
    auVar52 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar212 * auVar50._12_4_,
                                                 CONCAT48(fVar204 * auVar50._8_4_,
                                                          CONCAT44(fVar202 * auVar50._4_4_,
                                                                   fVar201 * auVar50._0_4_)))),
                              auVar71,ZEXT1632(auVar39));
    auVar54 = vfmadd231ps_fma(auVar20,auVar71,ZEXT1632(auVar49));
    auVar70 = vsubps_avx(ZEXT1632(auVar50),ZEXT1632(auVar39));
    auVar68 = vsubps_avx(ZEXT1632(auVar51),ZEXT1632(auVar49));
    auVar72 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar70 = vmulps_avx512vl(auVar70,auVar72);
    auVar68 = vmulps_avx512vl(auVar68,auVar72);
    auVar180._0_4_ = fVar203 * auVar70._0_4_;
    auVar180._4_4_ = fVar203 * auVar70._4_4_;
    auVar180._8_4_ = fVar203 * auVar70._8_4_;
    auVar180._12_4_ = fVar203 * auVar70._12_4_;
    auVar180._16_4_ = fVar203 * auVar70._16_4_;
    auVar180._20_4_ = fVar203 * auVar70._20_4_;
    auVar180._24_4_ = fVar203 * auVar70._24_4_;
    auVar180._28_4_ = 0;
    auVar70 = vmulps_avx512vl(auVar186,auVar68);
    auVar50 = vxorps_avx512vl(auVar76._0_16_,auVar76._0_16_);
    auVar73 = vpermt2ps_avx512vl(ZEXT1632(auVar52),_DAT_0205fd20,ZEXT1632(auVar50));
    auVar74 = vpermt2ps_avx512vl(ZEXT1632(auVar54),_DAT_0205fd20,ZEXT1632(auVar50));
    auVar117._0_4_ = auVar180._0_4_ + auVar52._0_4_;
    auVar117._4_4_ = auVar180._4_4_ + auVar52._4_4_;
    auVar117._8_4_ = auVar180._8_4_ + auVar52._8_4_;
    auVar117._12_4_ = auVar180._12_4_ + auVar52._12_4_;
    auVar117._16_4_ = auVar180._16_4_ + 0.0;
    auVar117._20_4_ = auVar180._20_4_ + 0.0;
    auVar117._24_4_ = auVar180._24_4_ + 0.0;
    auVar117._28_4_ = 0;
    auVar82 = ZEXT1632(auVar50);
    auVar68 = vpermt2ps_avx512vl(auVar180,_DAT_0205fd20,auVar82);
    auVar75 = vaddps_avx512vl(ZEXT1632(auVar54),auVar70);
    auVar76 = vpermt2ps_avx512vl(auVar70,_DAT_0205fd20,auVar82);
    auVar70 = vsubps_avx(auVar73,auVar68);
    auVar76 = vsubps_avx512vl(auVar74,auVar76);
    auVar68 = vmulps_avx512vl(auVar64,auVar80);
    auVar66 = vmulps_avx512vl(auVar69,auVar80);
    auVar68 = vfmadd231ps_avx512vl(auVar68,auVar71,auVar67);
    auVar66 = vfmadd231ps_avx512vl(auVar66,auVar71,auVar77);
    auVar67 = vmulps_avx512vl(auVar65,auVar80);
    auVar77 = vmulps_avx512vl(auVar81,auVar80);
    auVar67 = vfmadd231ps_avx512vl(auVar67,auVar71,auVar64);
    auVar69 = vfmadd231ps_avx512vl(auVar77,auVar71,auVar69);
    auVar77 = vmulps_avx512vl(auVar78,auVar80);
    auVar64 = vmulps_avx512vl(auVar79,auVar80);
    auVar39 = vfmadd231ps_fma(auVar77,auVar71,auVar65);
    auVar49 = vfmadd231ps_fma(auVar64,auVar71,auVar81);
    auVar77 = vmulps_avx512vl(auVar80,auVar67);
    auVar64 = vmulps_avx512vl(ZEXT1632(auVar37),auVar69);
    auVar68 = vfmadd231ps_avx512vl(auVar77,auVar71,auVar68);
    auVar66 = vfmadd231ps_avx512vl(auVar64,auVar71,auVar66);
    auVar67 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar212 * auVar39._12_4_,
                                            CONCAT48(fVar204 * auVar39._8_4_,
                                                     CONCAT44(fVar202 * auVar39._4_4_,
                                                              fVar201 * auVar39._0_4_)))),auVar71,
                         auVar67);
    auVar69 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar212 * auVar49._12_4_,
                                            CONCAT48(fVar204 * auVar49._8_4_,
                                                     CONCAT44(fVar202 * auVar49._4_4_,
                                                              fVar201 * auVar49._0_4_)))),auVar71,
                         auVar69);
    auVar21._4_4_ = fVar202 * auVar67._4_4_;
    auVar21._0_4_ = fVar201 * auVar67._0_4_;
    auVar21._8_4_ = fVar204 * auVar67._8_4_;
    auVar21._12_4_ = fVar212 * auVar67._12_4_;
    auVar21._16_4_ = auVar67._16_4_ * 0.0;
    auVar21._20_4_ = auVar67._20_4_ * 0.0;
    auVar21._24_4_ = auVar67._24_4_ * 0.0;
    auVar21._28_4_ = auVar81._28_4_;
    auVar22._4_4_ = fVar202 * auVar69._4_4_;
    auVar22._0_4_ = fVar201 * auVar69._0_4_;
    auVar22._8_4_ = fVar204 * auVar69._8_4_;
    auVar22._12_4_ = fVar212 * auVar69._12_4_;
    auVar22._16_4_ = auVar69._16_4_ * 0.0;
    auVar22._20_4_ = auVar69._20_4_ * 0.0;
    auVar22._24_4_ = auVar69._24_4_ * 0.0;
    auVar22._28_4_ = auVar65._28_4_;
    auVar81 = vfmadd231ps_avx512vl(auVar21,auVar71,auVar68);
    auVar71 = vfmadd231ps_avx512vl(auVar22,auVar66,auVar71);
    auVar68 = vsubps_avx512vl(auVar67,auVar68);
    auVar69 = vsubps_avx512vl(auVar69,auVar66);
    auVar68 = vmulps_avx512vl(auVar68,auVar72);
    auVar69 = vmulps_avx512vl(auVar69,auVar72);
    fVar188 = fVar203 * auVar68._0_4_;
    fVar201 = fVar203 * auVar68._4_4_;
    auVar23._4_4_ = fVar201;
    auVar23._0_4_ = fVar188;
    fVar202 = fVar203 * auVar68._8_4_;
    auVar23._8_4_ = fVar202;
    fVar204 = fVar203 * auVar68._12_4_;
    auVar23._12_4_ = fVar204;
    fVar212 = fVar203 * auVar68._16_4_;
    auVar23._16_4_ = fVar212;
    fVar213 = fVar203 * auVar68._20_4_;
    auVar23._20_4_ = fVar213;
    fVar203 = fVar203 * auVar68._24_4_;
    auVar23._24_4_ = fVar203;
    auVar23._28_4_ = auVar68._28_4_;
    auVar69 = vmulps_avx512vl(auVar186,auVar69);
    auVar72 = vpermt2ps_avx512vl(auVar81,_DAT_0205fd20,auVar82);
    auVar66 = vpermt2ps_avx512vl(auVar71,_DAT_0205fd20,auVar82);
    auVar187._0_4_ = auVar81._0_4_ + fVar188;
    auVar187._4_4_ = auVar81._4_4_ + fVar201;
    auVar187._8_4_ = auVar81._8_4_ + fVar202;
    auVar187._12_4_ = auVar81._12_4_ + fVar204;
    auVar187._16_4_ = auVar81._16_4_ + fVar212;
    auVar187._20_4_ = auVar81._20_4_ + fVar213;
    auVar187._24_4_ = auVar81._24_4_ + fVar203;
    auVar187._28_4_ = auVar81._28_4_ + auVar68._28_4_;
    auVar68 = vpermt2ps_avx512vl(auVar23,_DAT_0205fd20,ZEXT1632(auVar50));
    auVar67 = vaddps_avx512vl(auVar71,auVar69);
    auVar69 = vpermt2ps_avx512vl(auVar69,_DAT_0205fd20,ZEXT1632(auVar50));
    auVar68 = vsubps_avx(auVar72,auVar68);
    auVar69 = vsubps_avx512vl(auVar66,auVar69);
    auVar133 = ZEXT1632(auVar52);
    auVar77 = vsubps_avx512vl(auVar81,auVar133);
    auVar141 = ZEXT1632(auVar54);
    auVar64 = vsubps_avx512vl(auVar71,auVar141);
    auVar65 = vsubps_avx512vl(auVar72,auVar73);
    auVar77 = vaddps_avx512vl(auVar77,auVar65);
    auVar65 = vsubps_avx512vl(auVar66,auVar74);
    auVar64 = vaddps_avx512vl(auVar64,auVar65);
    auVar65 = vmulps_avx512vl(auVar141,auVar77);
    auVar65 = vfnmadd231ps_avx512vl(auVar65,auVar133,auVar64);
    auVar78 = vmulps_avx512vl(auVar75,auVar77);
    auVar78 = vfnmadd231ps_avx512vl(auVar78,auVar117,auVar64);
    auVar79 = vmulps_avx512vl(auVar76,auVar77);
    auVar79 = vfnmadd231ps_avx512vl(auVar79,auVar70,auVar64);
    auVar80 = vmulps_avx512vl(auVar74,auVar77);
    auVar80 = vfnmadd231ps_avx512vl(auVar80,auVar73,auVar64);
    auVar82 = vmulps_avx512vl(auVar71,auVar77);
    auVar82 = vfnmadd231ps_avx512vl(auVar82,auVar81,auVar64);
    auVar83 = vmulps_avx512vl(auVar67,auVar77);
    auVar83 = vfnmadd231ps_avx512vl(auVar83,auVar187,auVar64);
    auVar84 = vmulps_avx512vl(auVar69,auVar77);
    auVar84 = vfnmadd231ps_avx512vl(auVar84,auVar68,auVar64);
    auVar77 = vmulps_avx512vl(auVar66,auVar77);
    auVar77 = vfnmadd231ps_avx512vl(auVar77,auVar72,auVar64);
    auVar64 = vminps_avx512vl(auVar65,auVar78);
    auVar65 = vmaxps_avx512vl(auVar65,auVar78);
    auVar78 = vminps_avx512vl(auVar79,auVar80);
    auVar64 = vminps_avx512vl(auVar64,auVar78);
    auVar78 = vmaxps_avx512vl(auVar79,auVar80);
    auVar65 = vmaxps_avx512vl(auVar65,auVar78);
    auVar78 = vminps_avx512vl(auVar82,auVar83);
    auVar79 = vmaxps_avx512vl(auVar82,auVar83);
    auVar80 = vminps_avx512vl(auVar84,auVar77);
    auVar78 = vminps_avx512vl(auVar78,auVar80);
    auVar64 = vminps_avx512vl(auVar64,auVar78);
    auVar77 = vmaxps_avx512vl(auVar84,auVar77);
    auVar77 = vmaxps_avx512vl(auVar79,auVar77);
    auVar77 = vmaxps_avx512vl(auVar65,auVar77);
    uVar12 = vcmpps_avx512vl(auVar64,local_3c0,2);
    uVar14 = vcmpps_avx512vl(auVar77,local_3e0,5);
    uVar28 = 0;
    bVar24 = (byte)uVar12 & (byte)uVar14 & 0x7f;
    if (bVar24 != 0) {
      auVar77 = vsubps_avx512vl(auVar73,auVar133);
      auVar64 = vsubps_avx512vl(auVar74,auVar141);
      auVar65 = vsubps_avx512vl(auVar72,auVar81);
      auVar77 = vaddps_avx512vl(auVar77,auVar65);
      auVar65 = vsubps_avx512vl(auVar66,auVar71);
      auVar64 = vaddps_avx512vl(auVar64,auVar65);
      auVar65 = vmulps_avx512vl(auVar141,auVar77);
      auVar65 = vfnmadd231ps_avx512vl(auVar65,auVar64,auVar133);
      auVar75 = vmulps_avx512vl(auVar75,auVar77);
      auVar75 = vfnmadd213ps_avx512vl(auVar117,auVar64,auVar75);
      auVar76 = vmulps_avx512vl(auVar76,auVar77);
      auVar76 = vfnmadd213ps_avx512vl(auVar70,auVar64,auVar76);
      auVar70 = vmulps_avx512vl(auVar74,auVar77);
      auVar73 = vfnmadd231ps_avx512vl(auVar70,auVar64,auVar73);
      auVar70 = vmulps_avx512vl(auVar71,auVar77);
      auVar71 = vfnmadd231ps_avx512vl(auVar70,auVar64,auVar81);
      auVar70 = vmulps_avx512vl(auVar67,auVar77);
      auVar74 = vfnmadd213ps_avx512vl(auVar187,auVar64,auVar70);
      auVar70 = vmulps_avx512vl(auVar69,auVar77);
      auVar67 = vfnmadd213ps_avx512vl(auVar68,auVar64,auVar70);
      auVar70 = vmulps_avx512vl(auVar66,auVar77);
      auVar72 = vfnmadd231ps_avx512vl(auVar70,auVar72,auVar64);
      auVar68 = vminps_avx(auVar65,auVar75);
      auVar70 = vmaxps_avx(auVar65,auVar75);
      auVar69 = vminps_avx(auVar76,auVar73);
      auVar69 = vminps_avx(auVar68,auVar69);
      auVar68 = vmaxps_avx(auVar76,auVar73);
      auVar70 = vmaxps_avx(auVar70,auVar68);
      auVar81 = vminps_avx(auVar71,auVar74);
      auVar68 = vmaxps_avx(auVar71,auVar74);
      auVar71 = vminps_avx(auVar67,auVar72);
      auVar81 = vminps_avx(auVar81,auVar71);
      auVar81 = vminps_avx(auVar69,auVar81);
      auVar69 = vmaxps_avx(auVar67,auVar72);
      auVar68 = vmaxps_avx(auVar68,auVar69);
      auVar70 = vmaxps_avx(auVar70,auVar68);
      uVar12 = vcmpps_avx512vl(auVar70,local_3e0,5);
      uVar14 = vcmpps_avx512vl(auVar81,local_3c0,2);
      uVar28 = (uint)(bVar24 & (byte)uVar12 & (byte)uVar14);
    }
    if (uVar28 != 0) {
      auStack_5e0[uVar26] = uVar28;
      uVar12 = vmovlps_avx(auVar45);
      *(undefined8 *)(&uStack_460 + uVar26 * 2) = uVar12;
      uVar30 = vmovlps_avx512f(auVar53);
      auStack_3a0[uVar26] = uVar30;
      uVar26 = (ulong)((int)uVar26 + 1);
    }
    auVar45 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar106 = ZEXT1664(auVar45);
    auVar45 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar238 = ZEXT1664(auVar45);
    auVar45 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar239 = ZEXT1664(auVar45);
    auVar236._0_32_ = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar236._32_32_ = auVar99._32_32_;
    auVar237 = ZEXT3264(auVar236._0_32_);
    auVar240 = ZEXT464(0x3f800000);
    auVar85._16_48_ = auVar236._16_48_;
    auVar45 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar241 = ZEXT1664(auVar45);
    auVar100 = auVar85;
    do {
      auVar45 = auVar241._0_16_;
      if ((int)uVar26 == 0) {
        if (bVar34) {
          return local_761;
        }
        uVar104 = *(undefined4 *)(ray + k * 4 + 0x200);
        auVar16._4_4_ = uVar104;
        auVar16._0_4_ = uVar104;
        auVar16._8_4_ = uVar104;
        auVar16._12_4_ = uVar104;
        auVar16._16_4_ = uVar104;
        auVar16._20_4_ = uVar104;
        auVar16._24_4_ = uVar104;
        auVar16._28_4_ = uVar104;
        uVar12 = vcmpps_avx512vl(local_400,auVar16,2);
        uVar33 = (uint)uVar32 & (uint)uVar32 + 0xff & (uint)uVar12;
        uVar32 = (ulong)uVar33;
        local_761 = uVar33 != 0;
        if (!local_761) {
          return local_761;
        }
        goto LAB_01da2634;
      }
      uVar25 = (int)uVar26 - 1;
      uVar27 = (ulong)uVar25;
      uVar28 = (&uStack_460)[uVar27 * 2];
      fVar203 = afStack_45c[uVar27 * 2];
      uVar7 = auStack_5e0[uVar27];
      auVar234._8_8_ = 0;
      auVar234._0_8_ = auStack_3a0[uVar27];
      auVar236 = ZEXT1664(auVar234);
      lVar31 = 0;
      for (uVar30 = (ulong)uVar7; (uVar30 & 1) == 0; uVar30 = uVar30 >> 1 | 0x8000000000000000) {
        lVar31 = lVar31 + 1;
      }
      uVar29 = uVar7 - 1 & uVar7;
      auStack_5e0[uVar27] = uVar29;
      if (uVar29 == 0) {
        uVar26 = (ulong)uVar25;
      }
      auVar37 = vcvtsi2ss_avx512f(auVar242._0_16_,lVar31);
      auVar99._32_32_ = auVar100._32_32_;
      auVar39 = vmulss_avx512f(auVar37,SUB6416(ZEXT464(0x3e124925),0));
      lVar31 = lVar31 + 1;
      auVar37 = vcvtsi2ss_avx512f(auVar242._0_16_,lVar31);
      auVar37 = vmulss_avx512f(auVar37,SUB6416(ZEXT464(0x3e124925),0));
      auVar50 = auVar240._0_16_;
      auVar49 = vsubss_avx512f(auVar50,auVar39);
      auVar39 = vmulss_avx512f(ZEXT416((uint)fVar203),auVar39);
      auVar101._0_16_ = vfmadd231ss_avx512f(auVar39,ZEXT416(uVar28),auVar49);
      auVar39 = vsubss_avx512f(auVar50,auVar37);
      auVar37 = vfmadd231ss_fma(ZEXT416((uint)(fVar203 * auVar37._0_4_)),ZEXT416(uVar28),auVar39);
      auVar39 = vsubss_avx512f(auVar37,auVar101._0_16_);
      vucomiss_avx512f(auVar39);
      if (uVar7 == 0 || lVar31 == 0) break;
      auVar49 = vshufps_avx(auVar234,auVar234,0x50);
      vucomiss_avx512f(auVar39);
      auVar52 = vsubps_avx512vl(auVar45,auVar49);
      fVar203 = auVar49._0_4_;
      auVar128._0_4_ = fVar214 * fVar203;
      fVar188 = auVar49._4_4_;
      auVar128._4_4_ = fVar215 * fVar188;
      fVar201 = auVar49._8_4_;
      auVar128._8_4_ = fVar214 * fVar201;
      fVar202 = auVar49._12_4_;
      auVar128._12_4_ = fVar215 * fVar202;
      auVar138._0_4_ = fVar107 * fVar203;
      auVar138._4_4_ = fVar108 * fVar188;
      auVar138._8_4_ = fVar107 * fVar201;
      auVar138._12_4_ = fVar108 * fVar202;
      auVar146._0_4_ = fVar125 * fVar203;
      auVar146._4_4_ = fVar168 * fVar188;
      auVar146._8_4_ = fVar125 * fVar201;
      auVar146._12_4_ = fVar168 * fVar202;
      auVar111._0_4_ = fVar169 * fVar203;
      auVar111._4_4_ = fVar170 * fVar188;
      auVar111._8_4_ = fVar169 * fVar201;
      auVar111._12_4_ = fVar170 * fVar202;
      auVar49 = vfmadd231ps_fma(auVar128,auVar52,auVar47);
      auVar51 = vfmadd231ps_fma(auVar138,auVar52,auVar48);
      auVar53 = vfmadd231ps_avx512vl(auVar146,auVar52,auVar109);
      auVar52 = vfmadd231ps_fma(auVar111,auVar126,auVar52);
      auVar124._16_16_ = auVar49;
      auVar124._0_16_ = auVar49;
      auVar134._16_16_ = auVar51;
      auVar134._0_16_ = auVar51;
      auVar142._16_16_ = auVar53;
      auVar142._0_16_ = auVar53;
      auVar155._0_4_ = auVar101._0_4_;
      auVar155._4_4_ = auVar155._0_4_;
      auVar155._8_4_ = auVar155._0_4_;
      auVar155._12_4_ = auVar155._0_4_;
      uVar104 = auVar37._0_4_;
      auVar155._20_4_ = uVar104;
      auVar155._16_4_ = uVar104;
      auVar155._24_4_ = uVar104;
      auVar155._28_4_ = uVar104;
      auVar70 = vsubps_avx(auVar134,auVar124);
      auVar51 = vfmadd213ps_fma(auVar70,auVar155,auVar124);
      auVar70 = vsubps_avx(auVar142,auVar134);
      auVar54 = vfmadd213ps_fma(auVar70,auVar155,auVar134);
      auVar49 = vsubps_avx(auVar52,auVar53);
      auVar135._16_16_ = auVar49;
      auVar135._0_16_ = auVar49;
      auVar49 = vfmadd213ps_fma(auVar135,auVar155,auVar142);
      auVar70 = vsubps_avx(ZEXT1632(auVar54),ZEXT1632(auVar51));
      auVar51 = vfmadd213ps_fma(auVar70,auVar155,ZEXT1632(auVar51));
      auVar70 = vsubps_avx(ZEXT1632(auVar49),ZEXT1632(auVar54));
      auVar49 = vfmadd213ps_fma(auVar70,auVar155,ZEXT1632(auVar54));
      auVar70 = vsubps_avx(ZEXT1632(auVar49),ZEXT1632(auVar51));
      auVar59 = vfmadd231ps_fma(ZEXT1632(auVar51),auVar70,auVar155);
      auVar99._0_32_ = vmulps_avx512vl(auVar70,auVar237._0_32_);
      fVar203 = auVar39._0_4_ * 0.33333334;
      auVar147._0_8_ =
           CONCAT44(auVar59._4_4_ + fVar203 * auVar99._4_4_,auVar59._0_4_ + fVar203 * auVar99._0_4_)
      ;
      auVar147._8_4_ = auVar59._8_4_ + fVar203 * auVar99._8_4_;
      auVar147._12_4_ = auVar59._12_4_ + fVar203 * auVar99._12_4_;
      auVar129._0_4_ = fVar203 * auVar99._16_4_;
      auVar129._4_4_ = fVar203 * auVar99._20_4_;
      auVar129._8_4_ = fVar203 * auVar99._24_4_;
      auVar129._12_4_ = fVar203 * auVar99._28_4_;
      auVar136 = vsubps_avx((undefined1  [16])0x0,auVar129);
      auVar62 = vshufpd_avx(auVar59,auVar59,3);
      auVar60 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
      auVar49 = vsubps_avx(auVar62,auVar59);
      auVar51 = vsubps_avx(auVar60,(undefined1  [16])0x0);
      auVar157._0_4_ = auVar51._0_4_ + auVar49._0_4_;
      auVar157._4_4_ = auVar51._4_4_ + auVar49._4_4_;
      auVar157._8_4_ = auVar51._8_4_ + auVar49._8_4_;
      auVar157._12_4_ = auVar51._12_4_ + auVar49._12_4_;
      auVar49 = vshufps_avx(auVar59,auVar59,0xb1);
      auVar51 = vshufps_avx(auVar147,auVar147,0xb1);
      auVar52 = vshufps_avx(auVar136,auVar136,0xb1);
      auVar54 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
      auVar218._4_4_ = auVar157._0_4_;
      auVar218._0_4_ = auVar157._0_4_;
      auVar218._8_4_ = auVar157._0_4_;
      auVar218._12_4_ = auVar157._0_4_;
      auVar53 = vshufps_avx(auVar157,auVar157,0x55);
      fVar203 = auVar53._0_4_;
      auVar174._0_4_ = auVar49._0_4_ * fVar203;
      fVar188 = auVar53._4_4_;
      auVar174._4_4_ = auVar49._4_4_ * fVar188;
      fVar201 = auVar53._8_4_;
      auVar174._8_4_ = auVar49._8_4_ * fVar201;
      fVar202 = auVar53._12_4_;
      auVar174._12_4_ = auVar49._12_4_ * fVar202;
      auVar182._0_4_ = auVar51._0_4_ * fVar203;
      auVar182._4_4_ = auVar51._4_4_ * fVar188;
      auVar182._8_4_ = auVar51._8_4_ * fVar201;
      auVar182._12_4_ = auVar51._12_4_ * fVar202;
      auVar193._0_4_ = auVar52._0_4_ * fVar203;
      auVar193._4_4_ = auVar52._4_4_ * fVar188;
      auVar193._8_4_ = auVar52._8_4_ * fVar201;
      auVar193._12_4_ = auVar52._12_4_ * fVar202;
      auVar158._0_4_ = auVar54._0_4_ * fVar203;
      auVar158._4_4_ = auVar54._4_4_ * fVar188;
      auVar158._8_4_ = auVar54._8_4_ * fVar201;
      auVar158._12_4_ = auVar54._12_4_ * fVar202;
      auVar49 = vfmadd231ps_fma(auVar174,auVar218,auVar59);
      auVar51 = vfmadd231ps_fma(auVar182,auVar218,auVar147);
      auVar53 = vfmadd231ps_fma(auVar193,auVar218,auVar136);
      auVar58 = vfmadd231ps_fma(auVar158,(undefined1  [16])0x0,auVar218);
      auVar61 = vshufpd_avx(auVar49,auVar49,1);
      auVar55 = vshufpd_avx(auVar51,auVar51,1);
      auVar56 = vshufpd_avx(auVar53,auVar53,1);
      auVar57 = vshufpd_avx(auVar58,auVar58,1);
      auVar52 = vminss_avx(auVar49,auVar51);
      auVar49 = vmaxss_avx(auVar51,auVar49);
      auVar54 = vminss_avx(auVar53,auVar58);
      auVar51 = vmaxss_avx(auVar58,auVar53);
      auVar54 = vminss_avx(auVar52,auVar54);
      auVar49 = vmaxss_avx(auVar51,auVar49);
      auVar53 = vminss_avx(auVar61,auVar55);
      auVar51 = vmaxss_avx(auVar55,auVar61);
      auVar61 = vminss_avx(auVar56,auVar57);
      auVar52 = vmaxss_avx(auVar57,auVar56);
      auVar53 = vminss_avx(auVar53,auVar61);
      auVar51 = vmaxss_avx(auVar52,auVar51);
      fVar201 = auVar54._0_4_;
      auVar87._16_48_ = auVar99._16_48_;
      fVar188 = auVar51._0_4_;
      fVar203 = auVar49._0_4_;
      if ((0.0001 <= fVar201) || (fVar188 <= -0.0001)) {
        uVar12 = vcmpps_avx512vl(auVar53,SUB6416(ZEXT464(0x38d1b717),0),1);
        uVar14 = vcmpps_avx512vl(auVar54,SUB6416(ZEXT464(0x38d1b717),0),1);
        if ((-0.0001 < fVar203 & ((byte)uVar14 | (byte)uVar12)) != 0) goto LAB_01da352e;
        uVar12 = vcmpps_avx512vl(SUB6416(ZEXT464(0xb8d1b717),0),auVar51,5);
        uVar14 = vcmpps_avx512vl(auVar53,SUB6416(ZEXT464(0x38d1b717),0),5);
        if ((((ushort)uVar14 | (ushort)uVar12) & 1) == 0) goto LAB_01da352e;
        bVar13 = true;
        auVar236 = ZEXT1664(auVar234);
        auVar100._16_48_ = auVar87._16_48_;
        auVar100._0_16_ = auVar101._0_16_;
      }
      else {
LAB_01da352e:
        auVar55 = auVar244._0_16_;
        uVar12 = vcmpss_avx512f(auVar54,auVar55,1);
        bVar13 = (bool)((byte)uVar12 & 1);
        iVar102 = auVar240._0_4_;
        fVar202 = (float)((uint)bVar13 * -0x40800000 + (uint)!bVar13 * iVar102);
        uVar12 = vcmpss_avx512f(auVar49,auVar55,1);
        bVar13 = (bool)((byte)uVar12 & 1);
        fVar204 = (float)((uint)bVar13 * -0x40800000 + (uint)!bVar13 * iVar102);
        bVar13 = fVar202 != fVar204;
        iVar243 = auVar244._0_4_;
        auVar87._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
        auVar86._4_60_ = auVar87._4_60_;
        auVar86._0_4_ = (uint)bVar13 * iVar243 + (uint)!bVar13 * 0x7f800000;
        auVar61 = auVar86._0_16_;
        auVar89._16_48_ = auVar87._16_48_;
        auVar89._0_16_ = SUB6416(ZEXT464(0xff800000),0);
        auVar88._4_60_ = auVar89._4_60_;
        auVar88._0_4_ = (uint)bVar13 * iVar243 + (uint)!bVar13 * -0x800000;
        auVar52 = auVar88._0_16_;
        uVar12 = vcmpss_avx512f(auVar53,auVar55,1);
        bVar13 = (bool)((byte)uVar12 & 1);
        fVar212 = (float)((uint)bVar13 * -0x40800000 + (uint)!bVar13 * iVar102);
        if ((fVar202 != fVar212) || (NAN(fVar202) || NAN(fVar212))) {
          fVar202 = auVar53._0_4_;
          bVar13 = fVar202 == fVar201;
          if ((!bVar13) || (NAN(fVar202) || NAN(fVar201))) {
            auVar54 = vxorps_avx512vl(auVar54,auVar239._0_16_);
            auVar229._0_4_ = auVar54._0_4_ / (fVar202 - fVar201);
            auVar229._4_12_ = auVar54._4_12_;
            auVar54 = vsubss_avx512f(auVar50,auVar229);
            auVar53 = vfmadd213ss_avx512f(auVar54,auVar55,auVar229);
            auVar54 = auVar53;
          }
          else {
            vucomiss_avx512f(auVar55);
            auVar91._16_48_ = auVar87._16_48_;
            auVar91._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar90._4_60_ = auVar91._4_60_;
            auVar90._0_4_ = (uint)bVar13 * iVar243 + (uint)!bVar13 * 0x7f800000;
            auVar53 = auVar90._0_16_;
            auVar54 = ZEXT416((uint)bVar13 * 0x3f800000 + (uint)!bVar13 * -0x800000);
          }
          auVar61 = vminss_avx(auVar61,auVar53);
          auVar52 = vmaxss_avx(auVar54,auVar52);
        }
        uVar12 = vcmpss_avx512f(auVar51,auVar55,1);
        bVar13 = (bool)((byte)uVar12 & 1);
        fVar201 = (float)((uint)bVar13 * -0x40800000 + (uint)!bVar13 * iVar102);
        if ((fVar204 != fVar201) || (NAN(fVar204) || NAN(fVar201))) {
          bVar13 = fVar188 == fVar203;
          if ((!bVar13) || (NAN(fVar188) || NAN(fVar203))) {
            auVar49 = vxorps_avx512vl(auVar49,auVar239._0_16_);
            auVar194._0_4_ = auVar49._0_4_ / (fVar188 - fVar203);
            auVar194._4_12_ = auVar49._4_12_;
            auVar49 = vsubss_avx512f(auVar50,auVar194);
            auVar51 = vfmadd213ss_avx512f(auVar49,auVar55,auVar194);
            auVar49 = auVar51;
          }
          else {
            vucomiss_avx512f(auVar55);
            auVar93._16_48_ = auVar87._16_48_;
            auVar93._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar92._4_60_ = auVar93._4_60_;
            auVar92._0_4_ = (uint)bVar13 * iVar243 + (uint)!bVar13 * 0x7f800000;
            auVar51 = auVar92._0_16_;
            auVar49 = ZEXT416((uint)bVar13 * 0x3f800000 + (uint)!bVar13 * -0x800000);
          }
          auVar61 = vminss_avx(auVar61,auVar51);
          auVar52 = vmaxss_avx(auVar49,auVar52);
        }
        bVar13 = fVar212 != fVar201;
        auVar49 = vminss_avx512f(auVar61,auVar50);
        auVar95._16_48_ = auVar87._16_48_;
        auVar95._0_16_ = auVar61;
        auVar94._4_60_ = auVar95._4_60_;
        auVar94._0_4_ = (uint)bVar13 * auVar49._0_4_ + (uint)!bVar13 * auVar61._0_4_;
        auVar49 = vmaxss_avx512f(auVar50,auVar52);
        auVar97._16_48_ = auVar87._16_48_;
        auVar97._0_16_ = auVar52;
        auVar96._4_60_ = auVar97._4_60_;
        auVar96._0_4_ = (uint)bVar13 * auVar49._0_4_ + (uint)!bVar13 * auVar52._0_4_;
        auVar49 = vmaxss_avx512f(auVar55,auVar94._0_16_);
        auVar51 = vminss_avx512f(auVar96._0_16_,auVar50);
        bVar13 = true;
        if (auVar49._0_4_ <= auVar51._0_4_) {
          auVar55 = vmaxss_avx512f(auVar55,ZEXT416((uint)(auVar49._0_4_ + -0.1)));
          auVar56 = vminss_avx512f(ZEXT416((uint)(auVar51._0_4_ + 0.1)),auVar50);
          auVar112._0_8_ = auVar59._0_8_;
          auVar112._8_8_ = auVar112._0_8_;
          auVar183._8_8_ = auVar147._0_8_;
          auVar183._0_8_ = auVar147._0_8_;
          auVar195._8_8_ = auVar136._0_8_;
          auVar195._0_8_ = auVar136._0_8_;
          auVar49 = vshufpd_avx(auVar147,auVar147,3);
          auVar51 = vshufpd_avx(auVar136,auVar136,3);
          auVar52 = vshufps_avx(auVar55,auVar56,0);
          auVar57 = vsubps_avx512vl(auVar45,auVar52);
          fVar203 = auVar52._0_4_;
          auVar227._0_4_ = fVar203 * auVar62._0_4_;
          fVar188 = auVar52._4_4_;
          auVar227._4_4_ = fVar188 * auVar62._4_4_;
          fVar201 = auVar52._8_4_;
          auVar227._8_4_ = fVar201 * auVar62._8_4_;
          fVar202 = auVar52._12_4_;
          auVar227._12_4_ = fVar202 * auVar62._12_4_;
          auVar148._0_4_ = fVar203 * auVar49._0_4_;
          auVar148._4_4_ = fVar188 * auVar49._4_4_;
          auVar148._8_4_ = fVar201 * auVar49._8_4_;
          auVar148._12_4_ = fVar202 * auVar49._12_4_;
          auVar151._0_4_ = fVar203 * auVar51._0_4_;
          auVar151._4_4_ = fVar188 * auVar51._4_4_;
          auVar151._8_4_ = fVar201 * auVar51._8_4_;
          auVar151._12_4_ = fVar202 * auVar51._12_4_;
          auVar130._0_4_ = fVar203 * auVar60._0_4_;
          auVar130._4_4_ = fVar188 * auVar60._4_4_;
          auVar130._8_4_ = fVar201 * auVar60._8_4_;
          auVar130._12_4_ = fVar202 * auVar60._12_4_;
          auVar54 = vfmadd231ps_fma(auVar227,auVar57,auVar112);
          auVar53 = vfmadd231ps_fma(auVar148,auVar57,auVar183);
          auVar61 = vfmadd231ps_fma(auVar151,auVar57,auVar195);
          auVar62 = vfmadd231ps_fma(auVar130,auVar57,ZEXT816(0));
          auVar49 = vsubss_avx512f(auVar50,auVar55);
          auVar51 = vmovshdup_avx512vl(auVar234);
          auVar58 = vfmadd231ss_avx512f(ZEXT416((uint)(auVar51._0_4_ * auVar55._0_4_)),auVar234,
                                        auVar49);
          auVar49 = vsubss_avx512f(auVar50,auVar56);
          auVar59 = vfmadd231ss_avx512f(ZEXT416((uint)(auVar56._0_4_ * auVar51._0_4_)),auVar234,
                                        auVar49);
          auVar60 = vdivss_avx512f(auVar50,auVar39);
          auVar39 = vsubps_avx(auVar53,auVar54);
          auVar143 = auVar106._0_16_;
          auVar51 = vmulps_avx512vl(auVar39,auVar143);
          auVar39 = vsubps_avx(auVar61,auVar53);
          auVar52 = vmulps_avx512vl(auVar39,auVar143);
          auVar39 = vsubps_avx(auVar62,auVar61);
          auVar39 = vmulps_avx512vl(auVar39,auVar143);
          auVar49 = vminps_avx(auVar52,auVar39);
          auVar39 = vmaxps_avx(auVar52,auVar39);
          auVar49 = vminps_avx(auVar51,auVar49);
          auVar39 = vmaxps_avx(auVar51,auVar39);
          auVar51 = vshufpd_avx(auVar49,auVar49,3);
          auVar52 = vshufpd_avx(auVar39,auVar39,3);
          auVar49 = vminps_avx(auVar49,auVar51);
          auVar39 = vmaxps_avx(auVar39,auVar52);
          fVar203 = auVar60._0_4_;
          auVar175._0_4_ = fVar203 * auVar49._0_4_;
          auVar175._4_4_ = fVar203 * auVar49._4_4_;
          auVar175._8_4_ = fVar203 * auVar49._8_4_;
          auVar175._12_4_ = fVar203 * auVar49._12_4_;
          auVar159._0_4_ = fVar203 * auVar39._0_4_;
          auVar159._4_4_ = fVar203 * auVar39._4_4_;
          auVar159._8_4_ = fVar203 * auVar39._8_4_;
          auVar159._12_4_ = fVar203 * auVar39._12_4_;
          auVar60 = vdivss_avx512f(auVar50,ZEXT416((uint)(auVar59._0_4_ - auVar58._0_4_)));
          auVar39 = vshufpd_avx(auVar54,auVar54,3);
          auVar49 = vshufpd_avx(auVar53,auVar53,3);
          auVar51 = vshufpd_avx(auVar61,auVar61,3);
          auVar52 = vshufpd_avx(auVar62,auVar62,3);
          auVar39 = vsubps_avx(auVar39,auVar54);
          auVar54 = vsubps_avx(auVar49,auVar53);
          auVar53 = vsubps_avx(auVar51,auVar61);
          auVar52 = vsubps_avx(auVar52,auVar62);
          auVar49 = vminps_avx(auVar39,auVar54);
          auVar39 = vmaxps_avx(auVar39,auVar54);
          auVar51 = vminps_avx(auVar53,auVar52);
          auVar51 = vminps_avx(auVar49,auVar51);
          auVar49 = vmaxps_avx(auVar53,auVar52);
          auVar39 = vmaxps_avx(auVar39,auVar49);
          fVar203 = auVar60._0_4_;
          auVar196._0_4_ = fVar203 * auVar51._0_4_;
          auVar196._4_4_ = fVar203 * auVar51._4_4_;
          auVar196._8_4_ = fVar203 * auVar51._8_4_;
          auVar196._12_4_ = fVar203 * auVar51._12_4_;
          auVar206._0_4_ = fVar203 * auVar39._0_4_;
          auVar206._4_4_ = fVar203 * auVar39._4_4_;
          auVar206._8_4_ = fVar203 * auVar39._8_4_;
          auVar206._12_4_ = fVar203 * auVar39._12_4_;
          auVar136 = vinsertps_avx512f(auVar101._0_16_,auVar58,0x10);
          auVar54 = vinsertps_avx(auVar37,auVar59,0x10);
          auVar105._0_4_ = auVar136._0_4_ + auVar54._0_4_;
          auVar105._4_4_ = auVar136._4_4_ + auVar54._4_4_;
          auVar105._8_4_ = auVar136._8_4_ + auVar54._8_4_;
          auVar105._12_4_ = auVar136._12_4_ + auVar54._12_4_;
          auVar15._8_4_ = 0x3f000000;
          auVar15._0_8_ = 0x3f0000003f000000;
          auVar15._12_4_ = 0x3f000000;
          auVar56 = vmulps_avx512vl(auVar105,auVar15);
          auVar51 = vshufps_avx(auVar56,auVar56,0x54);
          uVar104 = auVar56._0_4_;
          auVar118._4_4_ = uVar104;
          auVar118._0_4_ = uVar104;
          auVar118._8_4_ = uVar104;
          auVar118._12_4_ = uVar104;
          auVar49 = vfmadd213ps_fma(auVar36,auVar118,auVar4);
          auVar53 = vfmadd213ps_avx512vl(auVar38,auVar118,auVar46);
          auVar52 = vfmadd213ps_fma(auVar85._0_16_,auVar118,auVar42);
          auVar39 = vsubps_avx(auVar53,auVar49);
          auVar49 = vfmadd213ps_fma(auVar39,auVar118,auVar49);
          auVar39 = vsubps_avx(auVar52,auVar53);
          auVar39 = vfmadd213ps_fma(auVar39,auVar118,auVar53);
          auVar39 = vsubps_avx(auVar39,auVar49);
          auVar49 = vfmadd231ps_fma(auVar49,auVar39,auVar118);
          auVar61 = vmulps_avx512vl(auVar39,auVar143);
          auVar219._8_8_ = auVar49._0_8_;
          auVar219._0_8_ = auVar49._0_8_;
          auVar39 = vshufpd_avx(auVar49,auVar49,3);
          auVar49 = vshufps_avx(auVar56,auVar56,0x55);
          auVar52 = vsubps_avx(auVar39,auVar219);
          auVar53 = vfmadd231ps_fma(auVar219,auVar49,auVar52);
          auVar230._8_8_ = auVar61._0_8_;
          auVar230._0_8_ = auVar61._0_8_;
          auVar39 = vshufpd_avx(auVar61,auVar61,3);
          auVar39 = vsubps_avx(auVar39,auVar230);
          auVar49 = vfmadd213ps_fma(auVar39,auVar49,auVar230);
          auVar119._0_8_ = auVar52._0_8_ ^ 0x8000000080000000;
          auVar119._8_4_ = auVar52._8_4_ ^ 0x80000000;
          auVar119._12_4_ = auVar52._12_4_ ^ 0x80000000;
          auVar39 = vmovshdup_avx(auVar49);
          auVar231._0_8_ = auVar39._0_8_ ^ 0x8000000080000000;
          auVar231._8_4_ = auVar39._8_4_ ^ 0x80000000;
          auVar231._12_4_ = auVar39._12_4_ ^ 0x80000000;
          auVar61 = vmovshdup_avx512vl(auVar52);
          auVar62 = vpermt2ps_avx512vl(auVar231,ZEXT416(5),auVar52);
          auVar39 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar39._0_4_ * auVar52._0_4_)),auVar49,
                                        auVar61);
          auVar49 = vpermt2ps_avx512vl(auVar49,SUB6416(ZEXT464(4),0),auVar119);
          auVar131._0_4_ = auVar39._0_4_;
          auVar131._4_4_ = auVar131._0_4_;
          auVar131._8_4_ = auVar131._0_4_;
          auVar131._12_4_ = auVar131._0_4_;
          auVar39 = vdivps_avx(auVar62,auVar131);
          auVar49 = vdivps_avx(auVar49,auVar131);
          fVar188 = auVar53._0_4_;
          auVar52 = vshufps_avx(auVar53,auVar53,0x55);
          fVar203 = auVar49._0_4_;
          auVar220._0_4_ = fVar188 * auVar39._0_4_ + auVar52._0_4_ * fVar203;
          auVar220._4_4_ = fVar188 * auVar39._4_4_ + auVar52._4_4_ * auVar49._4_4_;
          auVar220._8_4_ = fVar188 * auVar39._8_4_ + auVar52._8_4_ * auVar49._8_4_;
          auVar220._12_4_ = fVar188 * auVar39._12_4_ + auVar52._12_4_ * auVar49._12_4_;
          auVar57 = vsubps_avx(auVar51,auVar220);
          auVar53 = vmovshdup_avx(auVar39);
          auVar51 = vinsertps_avx(auVar175,auVar196,0x1c);
          auVar232._0_4_ = auVar53._0_4_ * auVar51._0_4_;
          auVar232._4_4_ = auVar53._4_4_ * auVar51._4_4_;
          auVar232._8_4_ = auVar53._8_4_ * auVar51._8_4_;
          auVar232._12_4_ = auVar53._12_4_ * auVar51._12_4_;
          auVar52 = vinsertps_avx(auVar159,auVar206,0x1c);
          auVar221._0_4_ = auVar53._0_4_ * auVar52._0_4_;
          auVar221._4_4_ = auVar53._4_4_ * auVar52._4_4_;
          auVar221._8_4_ = auVar53._8_4_ * auVar52._8_4_;
          auVar221._12_4_ = auVar53._12_4_ * auVar52._12_4_;
          auVar55 = vminps_avx512vl(auVar232,auVar221);
          auVar62 = vmaxps_avx(auVar221,auVar232);
          auVar60 = vmovshdup_avx(auVar49);
          auVar53 = vinsertps_avx(auVar196,auVar175,0x4c);
          auVar197._0_4_ = auVar60._0_4_ * auVar53._0_4_;
          auVar197._4_4_ = auVar60._4_4_ * auVar53._4_4_;
          auVar197._8_4_ = auVar60._8_4_ * auVar53._8_4_;
          auVar197._12_4_ = auVar60._12_4_ * auVar53._12_4_;
          auVar61 = vinsertps_avx(auVar206,auVar159,0x4c);
          auVar207._0_4_ = auVar60._0_4_ * auVar61._0_4_;
          auVar207._4_4_ = auVar60._4_4_ * auVar61._4_4_;
          auVar207._8_4_ = auVar60._8_4_ * auVar61._8_4_;
          auVar207._12_4_ = auVar60._12_4_ * auVar61._12_4_;
          auVar60 = vminps_avx(auVar197,auVar207);
          auVar55 = vaddps_avx512vl(auVar55,auVar60);
          auVar60 = vmaxps_avx(auVar207,auVar197);
          auVar198._0_4_ = auVar62._0_4_ + auVar60._0_4_;
          auVar198._4_4_ = auVar62._4_4_ + auVar60._4_4_;
          auVar198._8_4_ = auVar62._8_4_ + auVar60._8_4_;
          auVar198._12_4_ = auVar62._12_4_ + auVar60._12_4_;
          auVar208._8_8_ = 0x3f80000000000000;
          auVar208._0_8_ = 0x3f80000000000000;
          auVar62 = vsubps_avx(auVar208,auVar198);
          auVar60 = vsubps_avx(auVar208,auVar55);
          auVar55 = vsubps_avx(auVar136,auVar56);
          auVar56 = vsubps_avx(auVar54,auVar56);
          fVar212 = auVar55._0_4_;
          auVar233._0_4_ = fVar212 * auVar62._0_4_;
          fVar213 = auVar55._4_4_;
          auVar233._4_4_ = fVar213 * auVar62._4_4_;
          fVar223 = auVar55._8_4_;
          auVar233._8_4_ = fVar223 * auVar62._8_4_;
          fVar224 = auVar55._12_4_;
          auVar233._12_4_ = fVar224 * auVar62._12_4_;
          auVar63 = vbroadcastss_avx512vl(auVar39);
          auVar51 = vmulps_avx512vl(auVar63,auVar51);
          auVar52 = vmulps_avx512vl(auVar63,auVar52);
          auVar63 = vminps_avx512vl(auVar51,auVar52);
          auVar51 = vmaxps_avx(auVar52,auVar51);
          auVar176._0_4_ = fVar203 * auVar53._0_4_;
          auVar176._4_4_ = fVar203 * auVar53._4_4_;
          auVar176._8_4_ = fVar203 * auVar53._8_4_;
          auVar176._12_4_ = fVar203 * auVar53._12_4_;
          auVar160._0_4_ = fVar203 * auVar61._0_4_;
          auVar160._4_4_ = fVar203 * auVar61._4_4_;
          auVar160._8_4_ = fVar203 * auVar61._8_4_;
          auVar160._12_4_ = fVar203 * auVar61._12_4_;
          auVar52 = vminps_avx(auVar176,auVar160);
          auVar53 = vaddps_avx512vl(auVar63,auVar52);
          auVar61 = vmulps_avx512vl(auVar55,auVar60);
          fVar188 = auVar56._0_4_;
          auVar199._0_4_ = fVar188 * auVar62._0_4_;
          fVar201 = auVar56._4_4_;
          auVar199._4_4_ = fVar201 * auVar62._4_4_;
          fVar202 = auVar56._8_4_;
          auVar199._8_4_ = fVar202 * auVar62._8_4_;
          fVar204 = auVar56._12_4_;
          auVar199._12_4_ = fVar204 * auVar62._12_4_;
          auVar209._0_4_ = fVar188 * auVar60._0_4_;
          auVar209._4_4_ = fVar201 * auVar60._4_4_;
          auVar209._8_4_ = fVar202 * auVar60._8_4_;
          auVar209._12_4_ = fVar204 * auVar60._12_4_;
          auVar52 = vmaxps_avx(auVar160,auVar176);
          auVar161._0_4_ = auVar51._0_4_ + auVar52._0_4_;
          auVar161._4_4_ = auVar51._4_4_ + auVar52._4_4_;
          auVar161._8_4_ = auVar51._8_4_ + auVar52._8_4_;
          auVar161._12_4_ = auVar51._12_4_ + auVar52._12_4_;
          auVar177._8_8_ = 0x3f800000;
          auVar177._0_8_ = 0x3f800000;
          auVar51 = vsubps_avx(auVar177,auVar161);
          auVar52 = vsubps_avx(auVar177,auVar53);
          auVar228._0_4_ = fVar212 * auVar51._0_4_;
          auVar228._4_4_ = fVar213 * auVar51._4_4_;
          auVar228._8_4_ = fVar223 * auVar51._8_4_;
          auVar228._12_4_ = fVar224 * auVar51._12_4_;
          auVar222._0_4_ = fVar212 * auVar52._0_4_;
          auVar222._4_4_ = fVar213 * auVar52._4_4_;
          auVar222._8_4_ = fVar223 * auVar52._8_4_;
          auVar222._12_4_ = fVar224 * auVar52._12_4_;
          auVar162._0_4_ = fVar188 * auVar51._0_4_;
          auVar162._4_4_ = fVar201 * auVar51._4_4_;
          auVar162._8_4_ = fVar202 * auVar51._8_4_;
          auVar162._12_4_ = fVar204 * auVar51._12_4_;
          auVar178._0_4_ = fVar188 * auVar52._0_4_;
          auVar178._4_4_ = fVar201 * auVar52._4_4_;
          auVar178._8_4_ = fVar202 * auVar52._8_4_;
          auVar178._12_4_ = fVar204 * auVar52._12_4_;
          auVar51 = vminps_avx(auVar228,auVar222);
          auVar52 = vminps_avx(auVar162,auVar178);
          auVar53 = vminps_avx(auVar51,auVar52);
          auVar51 = vmaxps_avx(auVar222,auVar228);
          auVar52 = vmaxps_avx(auVar178,auVar162);
          auVar52 = vmaxps_avx(auVar52,auVar51);
          auVar62 = vminps_avx512vl(auVar233,auVar61);
          auVar51 = vminps_avx(auVar199,auVar209);
          auVar51 = vminps_avx(auVar62,auVar51);
          auVar51 = vhaddps_avx(auVar53,auVar51);
          auVar61 = vmaxps_avx512vl(auVar61,auVar233);
          auVar53 = vmaxps_avx(auVar209,auVar199);
          auVar53 = vmaxps_avx(auVar53,auVar61);
          auVar52 = vhaddps_avx(auVar52,auVar53);
          auVar51 = vshufps_avx(auVar51,auVar51,0xe8);
          auVar52 = vshufps_avx(auVar52,auVar52,0xe8);
          auVar163._0_4_ = auVar51._0_4_ + auVar57._0_4_;
          auVar163._4_4_ = auVar51._4_4_ + auVar57._4_4_;
          auVar163._8_4_ = auVar51._8_4_ + auVar57._8_4_;
          auVar163._12_4_ = auVar51._12_4_ + auVar57._12_4_;
          auVar179._0_4_ = auVar52._0_4_ + auVar57._0_4_;
          auVar179._4_4_ = auVar52._4_4_ + auVar57._4_4_;
          auVar179._8_4_ = auVar52._8_4_ + auVar57._8_4_;
          auVar179._12_4_ = auVar52._12_4_ + auVar57._12_4_;
          auVar51 = vmaxps_avx(auVar136,auVar163);
          auVar52 = vminps_avx(auVar179,auVar54);
          uVar30 = vcmpps_avx512vl(auVar52,auVar51,1);
          auVar51 = vinsertps_avx(auVar58,auVar59,0x10);
          auVar236 = ZEXT1664(auVar51);
          auVar52 = ZEXT416(5);
          if ((uVar30 & 3) == 0) {
            vucomiss_avx512f(auVar101._0_16_);
            auVar98._0_16_ = vxorps_avx512vl(auVar52,auVar52);
            auVar98._16_48_ = auVar87._16_48_;
            auVar244 = ZEXT1664(auVar98._0_16_);
            local_610 = auVar5._0_4_;
            fStack_60c = auVar5._4_4_;
            fStack_608 = auVar5._8_4_;
            fStack_604 = auVar5._12_4_;
            if ((uint)uVar26 < 4 && (uVar7 == 0 || lVar31 == 0)) {
              bVar13 = false;
              auVar100 = auVar98;
            }
            else {
              lVar31 = 200;
              auVar100 = auVar98;
              do {
                auVar52 = vsubss_avx512f(auVar50,auVar57);
                fVar202 = auVar52._0_4_;
                fVar188 = fVar202 * fVar202 * fVar202;
                fVar204 = auVar57._0_4_;
                fVar201 = fVar204 * 3.0 * fVar202 * fVar202;
                fVar202 = fVar202 * fVar204 * fVar204 * 3.0;
                auVar149._4_4_ = fVar188;
                auVar149._0_4_ = fVar188;
                auVar149._8_4_ = fVar188;
                auVar149._12_4_ = fVar188;
                auVar139._4_4_ = fVar201;
                auVar139._0_4_ = fVar201;
                auVar139._8_4_ = fVar201;
                auVar139._12_4_ = fVar201;
                auVar113._4_4_ = fVar202;
                auVar113._0_4_ = fVar202;
                auVar113._8_4_ = fVar202;
                auVar113._12_4_ = fVar202;
                fVar204 = fVar204 * fVar204 * fVar204;
                auVar152._0_4_ = local_610 * fVar204;
                auVar152._4_4_ = fStack_60c * fVar204;
                auVar152._8_4_ = fStack_608 * fVar204;
                auVar152._12_4_ = fStack_604 * fVar204;
                auVar52 = vfmadd231ps_fma(auVar152,auVar42,auVar113);
                auVar52 = vfmadd231ps_fma(auVar52,auVar46,auVar139);
                auVar52 = vfmadd231ps_fma(auVar52,auVar4,auVar149);
                auVar114._8_8_ = auVar52._0_8_;
                auVar114._0_8_ = auVar52._0_8_;
                auVar52 = vshufpd_avx(auVar52,auVar52,3);
                auVar54 = vshufps_avx(auVar57,auVar57,0x55);
                auVar52 = vsubps_avx(auVar52,auVar114);
                auVar54 = vfmadd213ps_fma(auVar52,auVar54,auVar114);
                fVar188 = auVar54._0_4_;
                auVar52 = vshufps_avx(auVar54,auVar54,0x55);
                auVar115._0_4_ = auVar39._0_4_ * fVar188 + fVar203 * auVar52._0_4_;
                auVar115._4_4_ = auVar39._4_4_ * fVar188 + auVar49._4_4_ * auVar52._4_4_;
                auVar115._8_4_ = auVar39._8_4_ * fVar188 + auVar49._8_4_ * auVar52._8_4_;
                auVar115._12_4_ = auVar39._12_4_ * fVar188 + auVar49._12_4_ * auVar52._12_4_;
                auVar57 = vsubps_avx(auVar57,auVar115);
                auVar52 = vandps_avx512vl(auVar54,auVar238._0_16_);
                auVar100._0_16_ = vprolq_avx512vl(auVar52,0x20);
                auVar52 = vmaxss_avx(auVar100._0_16_,auVar52);
                bVar35 = auVar52._0_4_ <= fVar103;
                if (auVar52._0_4_ < fVar103) {
                  auVar39 = vucomiss_avx512f(auVar98._0_16_);
                  if (bVar35) {
                    auVar49 = vucomiss_avx512f(auVar39);
                    auVar240 = ZEXT1664(auVar49);
                    if (bVar35) {
                      vmovshdup_avx(auVar39);
                      auVar49 = vucomiss_avx512f(auVar98._0_16_);
                      if (bVar35) {
                        auVar50 = vucomiss_avx512f(auVar49);
                        auVar240 = ZEXT1664(auVar50);
                        if (bVar35) {
                          auVar52 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]
                                                         ),ZEXT416((uint)pre->ray_space[k].vy.
                                                                         field_0.m128[2]),0x1c);
                          auVar56 = vinsertps_avx(auVar52,ZEXT416((uint)pre->ray_space[k].vz.field_0
                                                                        .m128[2]),0x28);
                          auVar52 = vdpps_avx(auVar56,local_470,0x7f);
                          auVar54 = vdpps_avx(auVar56,local_480,0x7f);
                          auVar53 = vdpps_avx(auVar56,local_490,0x7f);
                          auVar61 = vdpps_avx(auVar56,local_4a0,0x7f);
                          auVar62 = vdpps_avx(auVar56,local_4b0,0x7f);
                          auVar60 = vdpps_avx(auVar56,local_4c0,0x7f);
                          auVar55 = vdpps_avx(auVar56,local_4d0,0x7f);
                          auVar56 = vdpps_avx(auVar56,local_4e0,0x7f);
                          auVar57 = vsubss_avx512f(auVar50,auVar49);
                          fVar203 = auVar49._0_4_;
                          auVar49 = vfmadd231ss_fma(ZEXT416((uint)(fVar203 * auVar62._0_4_)),auVar57
                                                    ,auVar52);
                          auVar52 = vfmadd231ss_fma(ZEXT416((uint)(auVar60._0_4_ * fVar203)),auVar57
                                                    ,auVar54);
                          auVar54 = vfmadd231ss_fma(ZEXT416((uint)(auVar55._0_4_ * fVar203)),auVar57
                                                    ,auVar53);
                          auVar53 = vfmadd231ss_fma(ZEXT416((uint)(fVar203 * auVar56._0_4_)),auVar57
                                                    ,auVar61);
                          auVar100._0_16_ = vsubss_avx512f(auVar50,auVar39);
                          auVar153._0_4_ = auVar100._0_4_;
                          fVar203 = auVar153._0_4_ * auVar153._0_4_ * auVar153._0_4_;
                          fVar202 = auVar39._0_4_;
                          fVar188 = fVar202 * 3.0 * auVar153._0_4_ * auVar153._0_4_;
                          fVar201 = auVar153._0_4_ * fVar202 * fVar202 * 3.0;
                          fVar212 = fVar202 * fVar202 * fVar202;
                          auVar50 = vfmadd231ss_fma(ZEXT416((uint)(fVar212 * auVar53._0_4_)),
                                                    ZEXT416((uint)fVar201),auVar54);
                          auVar50 = vfmadd231ss_fma(auVar50,ZEXT416((uint)fVar188),auVar52);
                          auVar49 = vfmadd231ss_fma(auVar50,ZEXT416((uint)fVar203),auVar49);
                          fVar204 = auVar49._0_4_;
                          if ((fVar1 <= fVar204) &&
                             (fVar213 = *(float *)(ray + k * 4 + 0x200), fVar204 <= fVar213)) {
                            auVar49 = vshufps_avx(auVar39,auVar39,0x55);
                            auVar52 = vsubps_avx512vl(auVar45,auVar49);
                            fVar223 = auVar49._0_4_;
                            auVar184._0_4_ = fVar223 * (float)local_500._0_4_;
                            fVar224 = auVar49._4_4_;
                            auVar184._4_4_ = fVar224 * (float)local_500._4_4_;
                            fVar225 = auVar49._8_4_;
                            auVar184._8_4_ = fVar225 * fStack_4f8;
                            fVar171 = auVar49._12_4_;
                            auVar184._12_4_ = fVar171 * fStack_4f4;
                            auVar200._0_4_ = fVar223 * (float)local_550._0_4_;
                            auVar200._4_4_ = fVar224 * (float)local_550._4_4_;
                            auVar200._8_4_ = fVar225 * fStack_548;
                            auVar200._12_4_ = fVar171 * fStack_544;
                            auVar210._0_4_ = fVar223 * (float)local_560._0_4_;
                            auVar210._4_4_ = fVar224 * (float)local_560._4_4_;
                            auVar210._8_4_ = fVar225 * fStack_558;
                            auVar210._12_4_ = fVar171 * fStack_554;
                            auVar164._0_4_ = fVar223 * (float)local_520._0_4_;
                            auVar164._4_4_ = fVar224 * (float)local_520._4_4_;
                            auVar164._8_4_ = fVar225 * fStack_518;
                            auVar164._12_4_ = fVar171 * fStack_514;
                            auVar45 = vfmadd231ps_fma(auVar184,auVar52,local_4f0);
                            auVar49 = vfmadd231ps_fma(auVar200,auVar52,local_530);
                            auVar50 = vfmadd231ps_fma(auVar210,auVar52,local_540);
                            auVar52 = vfmadd231ps_fma(auVar164,auVar52,local_510);
                            auVar45 = vsubps_avx(auVar49,auVar45);
                            auVar49 = vsubps_avx(auVar50,auVar49);
                            auVar50 = vsubps_avx(auVar52,auVar50);
                            auVar211._0_4_ = fVar202 * auVar49._0_4_;
                            auVar211._4_4_ = fVar202 * auVar49._4_4_;
                            auVar211._8_4_ = fVar202 * auVar49._8_4_;
                            auVar211._12_4_ = fVar202 * auVar49._12_4_;
                            auVar153._4_4_ = auVar153._0_4_;
                            auVar153._8_4_ = auVar153._0_4_;
                            auVar153._12_4_ = auVar153._0_4_;
                            auVar45 = vfmadd231ps_fma(auVar211,auVar153,auVar45);
                            auVar165._0_4_ = fVar202 * auVar50._0_4_;
                            auVar165._4_4_ = fVar202 * auVar50._4_4_;
                            auVar165._8_4_ = fVar202 * auVar50._8_4_;
                            auVar165._12_4_ = fVar202 * auVar50._12_4_;
                            auVar49 = vfmadd231ps_fma(auVar165,auVar153,auVar49);
                            auVar166._0_4_ = fVar202 * auVar49._0_4_;
                            auVar166._4_4_ = fVar202 * auVar49._4_4_;
                            auVar166._8_4_ = fVar202 * auVar49._8_4_;
                            auVar166._12_4_ = fVar202 * auVar49._12_4_;
                            auVar45 = vfmadd231ps_fma(auVar166,auVar153,auVar45);
                            auVar100._0_16_ = vmulps_avx512vl(auVar45,auVar143);
                            pGVar8 = (context->scene->geometries).items[uVar33].ptr;
                            if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x240)) == 0) {
                              bVar35 = false;
                            }
                            else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                    (bVar35 = true,
                                    pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                              auVar150._0_4_ = fVar212 * (float)local_5a0._0_4_;
                              auVar150._4_4_ = fVar212 * (float)local_5a0._4_4_;
                              auVar150._8_4_ = fVar212 * fStack_598;
                              auVar150._12_4_ = fVar212 * fStack_594;
                              auVar140._4_4_ = fVar201;
                              auVar140._0_4_ = fVar201;
                              auVar140._8_4_ = fVar201;
                              auVar140._12_4_ = fVar201;
                              auVar45 = vfmadd132ps_fma(auVar140,auVar150,local_590);
                              auVar132._4_4_ = fVar188;
                              auVar132._0_4_ = fVar188;
                              auVar132._8_4_ = fVar188;
                              auVar132._12_4_ = fVar188;
                              auVar45 = vfmadd132ps_fma(auVar132,auVar45,local_580);
                              auVar120._4_4_ = fVar203;
                              auVar120._0_4_ = fVar203;
                              auVar120._8_4_ = fVar203;
                              auVar120._12_4_ = fVar203;
                              auVar50 = vfmadd132ps_fma(auVar120,auVar45,local_570);
                              auVar45 = vshufps_avx(auVar50,auVar50,0xc9);
                              auVar49 = vshufps_avx(auVar100._0_16_,auVar100._0_16_,0xc9);
                              auVar121._0_4_ = auVar50._0_4_ * auVar49._0_4_;
                              auVar121._4_4_ = auVar50._4_4_ * auVar49._4_4_;
                              auVar121._8_4_ = auVar50._8_4_ * auVar49._8_4_;
                              auVar121._12_4_ = auVar50._12_4_ * auVar49._12_4_;
                              auVar45 = vfmsub231ps_fma(auVar121,auVar100._0_16_,auVar45);
                              local_200 = vbroadcastss_avx512f(auVar39);
                              auVar99 = vbroadcastss_avx512f(ZEXT416(1));
                              local_1c0 = vpermps_avx512f(auVar99,ZEXT1664(auVar39));
                              auVar99 = vpermps_avx512f(auVar99,ZEXT1664(auVar45));
                              auVar236 = vbroadcastss_avx512f(ZEXT416(2));
                              local_280 = vpermps_avx512f(auVar236,ZEXT1664(auVar45));
                              local_240 = vbroadcastss_avx512f(auVar45);
                              local_2c0[0] = (RTCHitN)auVar99[0];
                              local_2c0[1] = (RTCHitN)auVar99[1];
                              local_2c0[2] = (RTCHitN)auVar99[2];
                              local_2c0[3] = (RTCHitN)auVar99[3];
                              local_2c0[4] = (RTCHitN)auVar99[4];
                              local_2c0[5] = (RTCHitN)auVar99[5];
                              local_2c0[6] = (RTCHitN)auVar99[6];
                              local_2c0[7] = (RTCHitN)auVar99[7];
                              local_2c0[8] = (RTCHitN)auVar99[8];
                              local_2c0[9] = (RTCHitN)auVar99[9];
                              local_2c0[10] = (RTCHitN)auVar99[10];
                              local_2c0[0xb] = (RTCHitN)auVar99[0xb];
                              local_2c0[0xc] = (RTCHitN)auVar99[0xc];
                              local_2c0[0xd] = (RTCHitN)auVar99[0xd];
                              local_2c0[0xe] = (RTCHitN)auVar99[0xe];
                              local_2c0[0xf] = (RTCHitN)auVar99[0xf];
                              local_2c0[0x10] = (RTCHitN)auVar99[0x10];
                              local_2c0[0x11] = (RTCHitN)auVar99[0x11];
                              local_2c0[0x12] = (RTCHitN)auVar99[0x12];
                              local_2c0[0x13] = (RTCHitN)auVar99[0x13];
                              local_2c0[0x14] = (RTCHitN)auVar99[0x14];
                              local_2c0[0x15] = (RTCHitN)auVar99[0x15];
                              local_2c0[0x16] = (RTCHitN)auVar99[0x16];
                              local_2c0[0x17] = (RTCHitN)auVar99[0x17];
                              local_2c0[0x18] = (RTCHitN)auVar99[0x18];
                              local_2c0[0x19] = (RTCHitN)auVar99[0x19];
                              local_2c0[0x1a] = (RTCHitN)auVar99[0x1a];
                              local_2c0[0x1b] = (RTCHitN)auVar99[0x1b];
                              local_2c0[0x1c] = (RTCHitN)auVar99[0x1c];
                              local_2c0[0x1d] = (RTCHitN)auVar99[0x1d];
                              local_2c0[0x1e] = (RTCHitN)auVar99[0x1e];
                              local_2c0[0x1f] = (RTCHitN)auVar99[0x1f];
                              local_2c0[0x20] = (RTCHitN)auVar99[0x20];
                              local_2c0[0x21] = (RTCHitN)auVar99[0x21];
                              local_2c0[0x22] = (RTCHitN)auVar99[0x22];
                              local_2c0[0x23] = (RTCHitN)auVar99[0x23];
                              local_2c0[0x24] = (RTCHitN)auVar99[0x24];
                              local_2c0[0x25] = (RTCHitN)auVar99[0x25];
                              local_2c0[0x26] = (RTCHitN)auVar99[0x26];
                              local_2c0[0x27] = (RTCHitN)auVar99[0x27];
                              local_2c0[0x28] = (RTCHitN)auVar99[0x28];
                              local_2c0[0x29] = (RTCHitN)auVar99[0x29];
                              local_2c0[0x2a] = (RTCHitN)auVar99[0x2a];
                              local_2c0[0x2b] = (RTCHitN)auVar99[0x2b];
                              local_2c0[0x2c] = (RTCHitN)auVar99[0x2c];
                              local_2c0[0x2d] = (RTCHitN)auVar99[0x2d];
                              local_2c0[0x2e] = (RTCHitN)auVar99[0x2e];
                              local_2c0[0x2f] = (RTCHitN)auVar99[0x2f];
                              local_2c0[0x30] = (RTCHitN)auVar99[0x30];
                              local_2c0[0x31] = (RTCHitN)auVar99[0x31];
                              local_2c0[0x32] = (RTCHitN)auVar99[0x32];
                              local_2c0[0x33] = (RTCHitN)auVar99[0x33];
                              local_2c0[0x34] = (RTCHitN)auVar99[0x34];
                              local_2c0[0x35] = (RTCHitN)auVar99[0x35];
                              local_2c0[0x36] = (RTCHitN)auVar99[0x36];
                              local_2c0[0x37] = (RTCHitN)auVar99[0x37];
                              local_2c0[0x38] = (RTCHitN)auVar99[0x38];
                              local_2c0[0x39] = (RTCHitN)auVar99[0x39];
                              local_2c0[0x3a] = (RTCHitN)auVar99[0x3a];
                              local_2c0[0x3b] = (RTCHitN)auVar99[0x3b];
                              local_2c0[0x3c] = (RTCHitN)auVar99[0x3c];
                              local_2c0[0x3d] = (RTCHitN)auVar99[0x3d];
                              local_2c0[0x3e] = (RTCHitN)auVar99[0x3e];
                              local_2c0[0x3f] = (RTCHitN)auVar99[0x3f];
                              local_180 = local_300._0_8_;
                              uStack_178 = local_300._8_8_;
                              uStack_170 = local_300._16_8_;
                              uStack_168 = local_300._24_8_;
                              uStack_160 = local_300._32_8_;
                              uStack_158 = local_300._40_8_;
                              uStack_150 = local_300._48_8_;
                              uStack_148 = local_300._56_8_;
                              auVar99 = vmovdqa64_avx512f(local_340);
                              local_140 = vmovdqa64_avx512f(auVar99);
                              vpcmpeqd_avx2(auVar99._0_32_,auVar99._0_32_);
                              local_100 = vbroadcastss_avx512f(ZEXT416(context->user->instID[0]));
                              local_c0 = vbroadcastss_avx512f(ZEXT416(context->user->instPrimID[0]))
                              ;
                              *(float *)(ray + k * 4 + 0x200) = fVar204;
                              local_440 = local_380;
                              local_5d0.valid = (int *)local_440;
                              local_5d0.geometryUserPtr = pGVar8->userPtr;
                              local_5d0.context = context->user;
                              local_5d0.ray = (RTCRayN *)ray;
                              local_5d0.hit = local_2c0;
                              local_5d0.N = 0x10;
                              if (pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                                (*pGVar8->occlusionFilterN)(&local_5d0);
                                auVar45 = vxorps_avx512vl(auVar98._0_16_,auVar98._0_16_);
                                auVar244 = ZEXT1664(auVar45);
                                auVar45 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                                auVar241 = ZEXT1664(auVar45);
                                auVar240 = ZEXT464(0x3f800000);
                                auVar70 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                auVar237 = ZEXT3264(auVar70);
                                auVar45 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                auVar239 = ZEXT1664(auVar45);
                                auVar45 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                auVar238 = ZEXT1664(auVar45);
                                auVar45 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                auVar106 = ZEXT1664(auVar45);
                                auVar70 = vbroadcastss_avx512vl(ZEXT416(2));
                                auVar242 = ZEXT3264(auVar70);
                              }
                              auVar45 = auVar244._0_16_;
                              auVar100 = vmovdqa64_avx512f(local_440);
                              uVar12 = vptestmd_avx512f(auVar100,auVar100);
                              if ((short)uVar12 == 0) {
                                bVar35 = false;
                              }
                              else {
                                p_Var11 = context->args->filter;
                                if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                                   (((context->args->flags &
                                     RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                     RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                    (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                                  (*p_Var11)(&local_5d0);
                                  auVar45 = vxorps_avx512vl(auVar45,auVar45);
                                  auVar244 = ZEXT1664(auVar45);
                                  auVar45 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                                  auVar241 = ZEXT1664(auVar45);
                                  auVar240 = ZEXT464(0x3f800000);
                                  auVar70 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                  auVar237 = ZEXT3264(auVar70);
                                  auVar45 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                  auVar239 = ZEXT1664(auVar45);
                                  auVar45 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                  auVar238 = ZEXT1664(auVar45);
                                  auVar45 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                  auVar106 = ZEXT1664(auVar45);
                                  auVar70 = vbroadcastss_avx512vl(ZEXT416(2));
                                  auVar242 = ZEXT3264(auVar70);
                                }
                                auVar99 = vmovdqa64_avx512f(local_440);
                                uVar30 = vptestmd_avx512f(auVar99,auVar99);
                                auVar99 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                                bVar35 = (bool)((byte)uVar30 & 1);
                                auVar100._0_4_ =
                                     (uint)bVar35 * auVar99._0_4_ |
                                     (uint)!bVar35 * *(int *)(local_5d0.ray + 0x200);
                                bVar35 = (bool)((byte)(uVar30 >> 1) & 1);
                                auVar100._4_4_ =
                                     (uint)bVar35 * auVar99._4_4_ |
                                     (uint)!bVar35 * *(int *)(local_5d0.ray + 0x204);
                                bVar35 = (bool)((byte)(uVar30 >> 2) & 1);
                                auVar100._8_4_ =
                                     (uint)bVar35 * auVar99._8_4_ |
                                     (uint)!bVar35 * *(int *)(local_5d0.ray + 0x208);
                                bVar35 = (bool)((byte)(uVar30 >> 3) & 1);
                                auVar100._12_4_ =
                                     (uint)bVar35 * auVar99._12_4_ |
                                     (uint)!bVar35 * *(int *)(local_5d0.ray + 0x20c);
                                bVar35 = (bool)((byte)(uVar30 >> 4) & 1);
                                auVar100._16_4_ =
                                     (uint)bVar35 * auVar99._16_4_ |
                                     (uint)!bVar35 * *(int *)(local_5d0.ray + 0x210);
                                bVar35 = (bool)((byte)(uVar30 >> 5) & 1);
                                auVar100._20_4_ =
                                     (uint)bVar35 * auVar99._20_4_ |
                                     (uint)!bVar35 * *(int *)(local_5d0.ray + 0x214);
                                bVar35 = (bool)((byte)(uVar30 >> 6) & 1);
                                auVar100._24_4_ =
                                     (uint)bVar35 * auVar99._24_4_ |
                                     (uint)!bVar35 * *(int *)(local_5d0.ray + 0x218);
                                bVar35 = (bool)((byte)(uVar30 >> 7) & 1);
                                auVar100._28_4_ =
                                     (uint)bVar35 * auVar99._28_4_ |
                                     (uint)!bVar35 * *(int *)(local_5d0.ray + 0x21c);
                                bVar35 = (bool)((byte)(uVar30 >> 8) & 1);
                                auVar100._32_4_ =
                                     (uint)bVar35 * auVar99._32_4_ |
                                     (uint)!bVar35 * *(int *)(local_5d0.ray + 0x220);
                                bVar35 = (bool)((byte)(uVar30 >> 9) & 1);
                                auVar100._36_4_ =
                                     (uint)bVar35 * auVar99._36_4_ |
                                     (uint)!bVar35 * *(int *)(local_5d0.ray + 0x224);
                                bVar35 = (bool)((byte)(uVar30 >> 10) & 1);
                                auVar100._40_4_ =
                                     (uint)bVar35 * auVar99._40_4_ |
                                     (uint)!bVar35 * *(int *)(local_5d0.ray + 0x228);
                                bVar35 = (bool)((byte)(uVar30 >> 0xb) & 1);
                                auVar100._44_4_ =
                                     (uint)bVar35 * auVar99._44_4_ |
                                     (uint)!bVar35 * *(int *)(local_5d0.ray + 0x22c);
                                bVar35 = (bool)((byte)(uVar30 >> 0xc) & 1);
                                auVar100._48_4_ =
                                     (uint)bVar35 * auVar99._48_4_ |
                                     (uint)!bVar35 * *(int *)(local_5d0.ray + 0x230);
                                bVar35 = (bool)((byte)(uVar30 >> 0xd) & 1);
                                auVar100._52_4_ =
                                     (uint)bVar35 * auVar99._52_4_ |
                                     (uint)!bVar35 * *(int *)(local_5d0.ray + 0x234);
                                bVar35 = (bool)((byte)(uVar30 >> 0xe) & 1);
                                auVar100._56_4_ =
                                     (uint)bVar35 * auVar99._56_4_ |
                                     (uint)!bVar35 * *(int *)(local_5d0.ray + 0x238);
                                bVar35 = SUB81(uVar30 >> 0xf,0);
                                auVar100._60_4_ =
                                     (uint)bVar35 * auVar99._60_4_ |
                                     (uint)!bVar35 * *(int *)(local_5d0.ray + 0x23c);
                                *(undefined1 (*) [64])(local_5d0.ray + 0x200) = auVar100;
                                bVar35 = (short)uVar30 != 0;
                              }
                              if (!bVar35) {
                                *(float *)(ray + k * 4 + 0x200) = fVar213;
                              }
                            }
                            auVar236 = ZEXT1664(auVar51);
                            bVar34 = (bool)(bVar34 | bVar35);
                          }
                        }
                      }
                    }
                  }
                  break;
                }
                lVar31 = lVar31 + -1;
              } while (lVar31 != 0);
            }
          }
          else {
            auVar45 = vxorps_avx512vl(ZEXT416(5),auVar52);
            auVar244 = ZEXT1664(auVar45);
            auVar100._16_48_ = auVar87._16_48_;
            auVar100._0_16_ = auVar109;
          }
        }
        else {
          auVar236 = ZEXT1664(auVar234);
          auVar101._16_48_ = auVar87._16_48_;
          auVar100 = auVar101;
        }
      }
      auVar99._32_32_ = auVar100._32_32_;
    } while (bVar13);
    auVar45 = vinsertps_avx512f(auVar101._0_16_,auVar37,0x10);
  } while( true );
}

Assistant:

static __forceinline bool occluded_hn(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; Vec3fa n0,dn0,n1,dn1; geom->gather_hermite(p0,t0,n0,dn0,p1,t1,n1,dn1,geom->curve(primID));
          if (Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,n0,dn0,n1,dn1,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }